

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argsman_tests.cpp
# Opt level: O0

void __thiscall argsman_tests::util_ReadConfigStream::test_method(util_ReadConfigStream *this)

{
  long lVar1;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  right_end;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  right_end_00;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  left_end;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  left_end_00;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  const_iterator pbVar9;
  size_type sVar10;
  long in_FS_OFFSET;
  pair<const_char_*,_ArgsManager::Flags> pVar11;
  char *in_stack_ffffffffffff9a98;
  char *in_stack_ffffffffffff9aa0;
  char *in_stack_ffffffffffff9aa8;
  string *in_stack_ffffffffffff9ab0;
  char *pcVar12;
  ArgsManager *in_stack_ffffffffffff9ab8;
  char *pcVar13;
  ArgsManager *in_stack_ffffffffffff9ac0;
  string *in_stack_ffffffffffff9ac8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *in_stack_ffffffffffff9ad0;
  ArgsManager *in_stack_ffffffffffff9ad8;
  string *in_stack_ffffffffffff9ae0;
  undefined4 in_stack_ffffffffffff9ae8;
  ChainType in_stack_ffffffffffff9aec;
  string *in_stack_ffffffffffff9b08;
  ArgsManager *in_stack_ffffffffffff9b10;
  equal_coll_impl *in_stack_ffffffffffff9b58;
  undefined7 in_stack_ffffffffffff9b90;
  undefined1 in_stack_ffffffffffff9b97;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_ffffffffffff9b98;
  undefined7 in_stack_ffffffffffff9ba0;
  undefined1 in_stack_ffffffffffff9ba7;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_ffffffffffff9ba8;
  undefined1 *local_62c0;
  undefined1 *local_6090;
  path *local_5290;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *sec2_ccc_res;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *sec1_ccc_res;
  bool def;
  const_iterator __end1;
  const_iterator __begin1;
  initializer_list<bool> *__range1;
  char *str_config;
  util_ReadConfigStream *this_local;
  const_string local_50c0 [2];
  lazy_ostream local_50a0 [2];
  allocator<char> local_507a;
  allocator<char> local_5079;
  assertion_result local_5078 [2];
  const_string local_5040 [2];
  lazy_ostream local_5020 [2];
  undefined8 local_5000;
  assertion_result local_4fe0 [2];
  const_string local_4fa8 [2];
  lazy_ostream local_4f88 [2];
  allocator<char> local_4f61 [25];
  assertion_result local_4f48 [2];
  const_string local_4f10 [2];
  lazy_ostream local_4ef0 [2];
  allocator<char> local_4eca;
  allocator<char> local_4ec9;
  assertion_result local_4ec8 [2];
  allocator<char> local_4e89;
  const_string local_4e88 [2];
  lazy_ostream local_4e68 [2];
  allocator<char> local_4e42;
  allocator<char> local_4e41;
  assertion_result local_4e40 [2];
  const_string local_4e08 [2];
  lazy_ostream local_4de8 [2];
  allocator<char> local_4dc1 [25];
  assertion_result local_4da8 [2];
  const_string local_4d70 [2];
  lazy_ostream local_4d50 [2];
  allocator<char> local_4d29 [25];
  assertion_result local_4d10 [2];
  const_string local_4cd8 [2];
  lazy_ostream local_4cb8 [2];
  allocator<char> local_4c92;
  allocator<char> local_4c91;
  assertion_result local_4c90 [2];
  allocator<char> local_4c51;
  const_string local_4c50 [2];
  lazy_ostream local_4c30 [2];
  allocator<char> local_4c0a;
  allocator<char> local_4c09;
  assertion_result local_4c08 [2];
  const_string local_4bd0 [2];
  lazy_ostream local_4bb0 [2];
  allocator<char> local_4b89 [25];
  assertion_result local_4b70 [2];
  const_string local_4b38 [2];
  lazy_ostream local_4b18 [2];
  allocator<char> local_4af2;
  allocator<char> local_4af1;
  assertion_result local_4af0 [2];
  allocator<char> local_4ab3;
  allocator<char> local_4ab2;
  allocator<char> local_4ab1;
  const_string local_4ab0;
  lazy_ostream local_4aa0 [2];
  assertion_result local_4a78 [2];
  allocator<char> local_4a39 [30];
  allocator<char> local_4a1b;
  allocator<char> local_4a1a;
  allocator<char> local_4a19;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  sec2_ccc_expected;
  const_string local_4a00 [2];
  lazy_ostream local_49e0 [2];
  allocator<char> local_49ba;
  allocator<char> local_49b9;
  assertion_result local_49b8 [2];
  const_string local_4980 [2];
  lazy_ostream local_4960 [2];
  allocator<char> local_493a;
  allocator<char> local_4939;
  assertion_result local_4938 [2];
  const_string local_4900 [2];
  lazy_ostream local_48e0 [2];
  allocator<char> local_48ba;
  allocator<char> local_48b9;
  assertion_result local_48b8 [2];
  const_string local_4880 [2];
  lazy_ostream local_4860 [2];
  allocator<char> local_483a;
  allocator<char> local_4839;
  assertion_result local_4838 [2];
  const_string local_4800 [2];
  lazy_ostream local_47e0 [2];
  allocator<char> local_47ba;
  allocator<char> local_47b9;
  assertion_result local_47b8 [2];
  const_string local_4780 [2];
  lazy_ostream local_4760 [2];
  allocator<char> local_473a;
  allocator<char> local_4739;
  assertion_result local_4738 [2];
  const_string local_4700 [2];
  lazy_ostream local_46e0 [2];
  allocator<char> local_46ba;
  allocator<char> local_46b9;
  assertion_result local_46b8 [2];
  const_string local_4680 [2];
  lazy_ostream local_4660 [2];
  allocator<char> local_463a;
  allocator<char> local_4639;
  assertion_result local_4638 [2];
  const_string local_4600 [2];
  lazy_ostream local_45e0 [2];
  allocator<char> local_45ba;
  allocator<char> local_45b9;
  assertion_result local_45b8 [2];
  allocator<char> local_4579;
  const_string local_4578;
  lazy_ostream local_4568 [2];
  assertion_result local_4540 [2];
  allocator<char> local_4501 [29];
  allocator<char> local_44e4;
  allocator<char> local_44e3;
  allocator<char> local_44e2;
  allocator<char> local_44e1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  sec1_ccc_expected;
  const_string local_44c8 [2];
  lazy_ostream local_44a8 [2];
  allocator<char> local_4482;
  allocator<char> local_4481;
  assertion_result local_4480 [2];
  const_string local_4448 [2];
  lazy_ostream local_4428 [2];
  allocator<char> local_4402;
  allocator<char> local_4401;
  assertion_result local_4400 [2];
  const_string local_43c8 [2];
  lazy_ostream local_43a8 [2];
  allocator<char> local_4382;
  allocator<char> local_4381;
  assertion_result local_4380 [2];
  allocator<char> local_4342;
  allocator<char> local_4341;
  undefined1 local_4340 [16];
  undefined1 local_4330 [70];
  allocator<char> local_42ea;
  allocator<char> local_42e9;
  undefined1 local_42e8 [16];
  undefined1 local_42d8 [70];
  allocator<char> local_4292;
  allocator<char> local_4291;
  undefined1 local_4290 [16];
  undefined1 local_4280 [70];
  allocator<char> local_423a;
  allocator<char> local_4239;
  undefined1 local_4238 [16];
  undefined1 local_4228 [70];
  allocator<char> local_41e2;
  allocator<char> local_41e1;
  undefined1 local_41e0 [16];
  undefined1 local_41d0 [70];
  allocator<char> local_418a;
  allocator<char> local_4189;
  undefined1 local_4188 [16];
  undefined1 local_4178 [71];
  allocator<char> local_4131;
  const_string local_4130 [2];
  lazy_ostream local_4110 [2];
  allocator<char> local_40e9;
  assertion_result local_40e8 [2];
  const_string local_40b0 [2];
  lazy_ostream local_4090 [2];
  allocator<char> local_4069;
  assertion_result local_4068 [2];
  const_string local_4030 [2];
  lazy_ostream local_4010;
  undefined8 local_4000;
  allocator<char> local_3fe9;
  assertion_result local_3fe8 [2];
  const_string local_3fb0 [2];
  lazy_ostream local_3f90 [2];
  allocator<char> local_3f69;
  assertion_result local_3f68 [2];
  const_string local_3f30 [2];
  lazy_ostream local_3f10 [2];
  allocator<char> local_3ee9;
  assertion_result local_3ee8 [2];
  const_string local_3eb0 [2];
  lazy_ostream local_3e90 [2];
  allocator<char> local_3e69;
  assertion_result local_3e68 [2];
  const_string local_3e30 [2];
  lazy_ostream local_3e10 [2];
  allocator<char> local_3de9;
  assertion_result local_3de8 [2];
  const_string local_3db0 [2];
  lazy_ostream local_3d90 [2];
  allocator<char> local_3d69;
  assertion_result local_3d68 [2];
  const_string local_3d30 [2];
  lazy_ostream local_3d10 [2];
  allocator<char> local_3ce9;
  assertion_result local_3ce8 [2];
  const_string local_3cb0 [2];
  lazy_ostream local_3c90 [2];
  allocator<char> local_3c69 [25];
  assertion_result local_3c50 [2];
  const_string local_3c18 [2];
  lazy_ostream local_3bf8 [2];
  allocator<char> local_3bd1 [25];
  assertion_result local_3bb8 [2];
  const_string local_3b80 [2];
  lazy_ostream local_3b60 [2];
  allocator<char> local_3b39 [32];
  allocator<char> local_3b19 [25];
  assertion_result local_3b00 [2];
  const_string local_3ac8 [2];
  lazy_ostream local_3aa8 [2];
  allocator<char> local_3a81 [25];
  assertion_result local_3a68 [2];
  const_string local_3a30 [2];
  lazy_ostream local_3a10 [2];
  allocator<char> local_39e9 [25];
  assertion_result local_39d0 [2];
  const_string local_3998 [2];
  lazy_ostream local_3978 [2];
  allocator<char> local_3951 [25];
  assertion_result local_3938 [2];
  const_string local_3900 [2];
  lazy_ostream local_38e0 [2];
  allocator<char> local_38b9 [32];
  allocator<char> local_3899 [25];
  assertion_result local_3880 [2];
  const_string local_3848 [2];
  lazy_ostream local_3828 [2];
  allocator<char> local_3801 [25];
  assertion_result local_37e8 [2];
  const_string local_37b0 [2];
  lazy_ostream local_3790 [2];
  allocator<char> local_3769 [25];
  assertion_result local_3750 [2];
  const_string local_3718 [2];
  lazy_ostream local_36f8 [2];
  allocator<char> local_36d1 [32];
  allocator<char> local_36b1 [32];
  allocator<char> local_3691 [25];
  assertion_result local_3678 [2];
  const_string local_3640 [2];
  lazy_ostream local_3620 [2];
  allocator<char> local_35f9 [32];
  allocator<char> local_35d9 [25];
  assertion_result local_35c0 [2];
  const_string local_3588 [2];
  lazy_ostream local_3568 [2];
  allocator<char> local_3541 [32];
  allocator<char> local_3521 [25];
  assertion_result local_3508 [2];
  const_string local_34d0 [2];
  lazy_ostream local_34b0 [2];
  allocator<char> local_3489;
  assertion_result local_3488 [2];
  const_string local_3450 [2];
  lazy_ostream local_3430 [2];
  allocator<char> local_3409;
  assertion_result local_3408 [2];
  const_string local_33d0 [2];
  lazy_ostream local_33b0 [2];
  allocator<char> local_3389;
  assertion_result local_3388 [2];
  const_string local_3350 [2];
  lazy_ostream local_3330 [2];
  allocator<char> local_3309;
  assertion_result local_3308 [2];
  const_string local_32d0 [2];
  lazy_ostream local_32b0 [2];
  allocator<char> local_3289;
  assertion_result local_3288 [2];
  const_string local_3250 [2];
  lazy_ostream local_3230 [2];
  allocator<char> local_3209;
  assertion_result local_3208 [2];
  const_string local_31d0 [2];
  lazy_ostream local_31b0 [2];
  allocator<char> local_3189;
  assertion_result local_3188 [2];
  const_string local_3150 [2];
  lazy_ostream local_3130 [2];
  allocator<char> local_3109;
  assertion_result local_3108 [2];
  const_string local_30d0 [2];
  lazy_ostream local_30b0 [2];
  allocator<char> local_3089;
  assertion_result local_3088 [2];
  const_string local_3050 [2];
  lazy_ostream local_3030 [2];
  allocator<char> local_3009;
  assertion_result local_3008 [2];
  undefined1 *local_2fd0;
  undefined8 local_2fc8;
  allocator<char> local_2fba;
  allocator<char> local_2fb9;
  undefined1 local_2fb8 [16];
  undefined1 local_2fa8 [70];
  allocator<char> local_2f62;
  allocator<char> local_2f61;
  undefined1 local_2f60 [16];
  undefined1 local_2f50 [70];
  allocator<char> local_2f0a;
  allocator<char> local_2f09;
  undefined1 local_2f08 [16];
  undefined1 local_2ef8 [70];
  allocator<char> local_2eb2;
  allocator<char> local_2eb1;
  undefined1 local_2eb0 [16];
  undefined1 local_2ea0 [70];
  allocator<char> local_2e5a;
  allocator<char> local_2e59;
  undefined1 local_2e58 [16];
  undefined1 local_2e48 [70];
  allocator<char> local_2e02;
  allocator<char> local_2e01;
  undefined1 local_2e00 [16];
  undefined1 local_2df0 [70];
  allocator<char> local_2daa;
  allocator<char> local_2da9;
  undefined1 local_2da8 [16];
  undefined1 local_2d98 [70];
  allocator<char> local_2d52;
  allocator<char> local_2d51;
  undefined1 local_2d50 [16];
  undefined1 local_2d40 [70];
  allocator<char> local_2cfa;
  allocator<char> local_2cf9;
  undefined1 local_2cf8 [16];
  undefined1 local_2ce8 [70];
  allocator<char> local_2ca2;
  allocator<char> local_2ca1;
  undefined1 local_2ca0 [16];
  undefined1 local_2c90 [64];
  const_string local_2c50 [2];
  lazy_ostream local_2c30 [2];
  allocator<char> local_2c09;
  assertion_result local_2c08 [2];
  const_string local_2bd0 [2];
  lazy_ostream local_2bb0 [2];
  allocator<char> local_2b89;
  assertion_result local_2b88 [2];
  const_string local_2b50 [2];
  lazy_ostream local_2b30 [2];
  allocator<char> local_2b09;
  assertion_result local_2b08 [2];
  const_string local_2ad0 [2];
  lazy_ostream local_2ab0 [2];
  allocator<char> local_2a89;
  assertion_result local_2a88 [2];
  const_string local_2a50 [2];
  lazy_ostream local_2a30 [2];
  allocator<char> local_2a09;
  assertion_result local_2a08 [2];
  const_string local_29d0 [2];
  lazy_ostream local_29b0 [2];
  allocator<char> local_2989;
  assertion_result local_2988 [2];
  const_string local_2950 [2];
  lazy_ostream local_2930 [2];
  allocator<char> local_2909;
  assertion_result local_2908 [2];
  const_string local_28d0 [2];
  lazy_ostream local_28b0 [2];
  allocator<char> local_2889;
  assertion_result local_2888 [2];
  const_string local_2850 [2];
  lazy_ostream local_2830 [2];
  allocator<char> local_2809;
  assertion_result local_2808 [2];
  const_string local_27d0 [2];
  lazy_ostream local_27b0 [2];
  allocator<char> local_2789;
  assertion_result local_2788 [2];
  const_string local_2750 [2];
  lazy_ostream local_2730 [2];
  allocator<char> local_270a;
  allocator<char> local_2709;
  size_type local_2708;
  assertion_result local_2700 [2];
  const_string local_26c8 [2];
  lazy_ostream local_26a8 [2];
  allocator<char> local_2682;
  allocator<char> local_2681;
  size_type local_2680;
  assertion_result local_2678 [2];
  const_string local_2640 [2];
  lazy_ostream local_2620 [2];
  allocator<char> local_25fa;
  allocator<char> local_25f9;
  size_type local_25f8;
  assertion_result local_25f0 [2];
  const_string local_25b8 [2];
  lazy_ostream local_2598 [2];
  allocator<char> local_2572;
  allocator<char> local_2571;
  size_type local_2570;
  assertion_result local_2568 [2];
  const_string local_2530 [2];
  lazy_ostream local_2510 [2];
  allocator<char> local_24ea;
  allocator<char> local_24e9;
  size_type local_24e8;
  assertion_result local_24e0 [2];
  const_string local_24a8 [2];
  lazy_ostream local_2488 [2];
  allocator<char> local_2462;
  allocator<char> local_2461;
  size_type local_2460;
  assertion_result local_2458 [2];
  const_string local_2420 [2];
  lazy_ostream local_2400 [2];
  allocator<char> local_23da;
  allocator<char> local_23d9;
  size_type local_23d8;
  assertion_result local_23d0 [2];
  const_string local_2398 [2];
  lazy_ostream local_2378 [2];
  allocator<char> local_2352;
  allocator<char> local_2351;
  size_type local_2350;
  assertion_result local_2348 [2];
  const_string local_2310 [2];
  lazy_ostream local_22f0 [2];
  allocator<char> local_22ca;
  allocator<char> local_22c9;
  size_type local_22c8;
  assertion_result local_22c0 [2];
  const_string local_2288 [2];
  lazy_ostream local_2268 [2];
  allocator<char> local_2242;
  allocator<char> local_2241;
  size_type local_2240;
  assertion_result local_2238 [2];
  const_string local_2200 [2];
  lazy_ostream local_21e0 [2];
  allocator<char> local_21ba;
  allocator<char> local_21b9;
  size_type local_21b8;
  assertion_result local_21b0 [2];
  const_string local_2178 [2];
  lazy_ostream local_2158 [2];
  allocator<char> local_2132;
  allocator<char> local_2131;
  size_type local_2130;
  assertion_result local_2128 [2];
  const_string local_20f0 [2];
  lazy_ostream local_20d0 [2];
  allocator<char> local_20a9;
  assertion_result local_20a8 [2];
  const_string local_2070 [2];
  lazy_ostream local_2050 [2];
  allocator<char> local_2029;
  assertion_result local_2028;
  undefined8 local_2000;
  const_string local_1ff0 [2];
  lazy_ostream local_1fd0 [2];
  allocator<char> local_1fa9;
  assertion_result local_1fa8 [2];
  const_string local_1f70 [2];
  lazy_ostream local_1f50 [2];
  assertion_result local_1f30 [2];
  const_string local_1ef8 [2];
  lazy_ostream local_1ed8 [2];
  assertion_result local_1eb8 [2];
  allocator<char> local_1e7a [26];
  char *local_1e60;
  Flags local_1e58;
  undefined4 local_1e4c;
  char *local_1e48;
  Flags local_1e40;
  undefined4 local_1e34;
  char *local_1e30;
  Flags local_1e28;
  undefined4 local_1e1c;
  char *local_1e18;
  Flags local_1e10;
  undefined4 local_1e04;
  char *local_1e00;
  Flags local_1df8;
  undefined4 local_1dec;
  char *local_1de8;
  Flags local_1de0;
  undefined4 local_1dd4;
  char *local_1dd0;
  Flags local_1dc8;
  undefined4 local_1dbc;
  char *local_1db8;
  Flags local_1db0;
  undefined4 local_1da4;
  char *local_1da0;
  Flags local_1d98;
  undefined4 local_1d8c;
  char *local_1d88;
  Flags local_1d80;
  undefined4 local_1d78;
  undefined1 local_1d72;
  undefined1 local_1d71;
  pair<const_char_*,_ArgsManager::Flags> iii;
  pair<const_char_*,_ArgsManager::Flags> i;
  pair<const_char_*,_ArgsManager::Flags> h;
  pair<const_char_*,_ArgsManager::Flags> ggg;
  pair<const_char_*,_ArgsManager::Flags> fff;
  pair<const_char_*,_ArgsManager::Flags> e;
  pair<const_char_*,_ArgsManager::Flags> d;
  pair<const_char_*,_ArgsManager::Flags> ccc;
  pair<const_char_*,_ArgsManager::Flags> b;
  pair<const_char_*,_ArgsManager::Flags> a;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock16;
  undefined1 local_1900 [96];
  undefined1 local_18a0 [928];
  undefined1 local_1500 [128];
  undefined1 local_1480 [352];
  undefined1 local_1320 [96];
  undefined1 local_12c0 [96];
  undefined1 local_1260 [96];
  undefined1 local_1200 [96];
  undefined1 local_11a0 [96];
  undefined1 local_1140 [320];
  undefined8 local_1000;
  undefined1 local_c20 [96];
  undefined1 local_bc0 [96];
  undefined1 local_b60 [96];
  undefined1 local_b00 [96];
  undefined1 local_aa0 [96];
  undefined1 local_a40 [96];
  undefined1 local_9e0 [96];
  undefined1 local_980 [96];
  undefined1 local_920 [96];
  undefined1 local_8c0 [1248];
  undefined1 local_3e0 [400];
  TestArgsManager test_args;
  
  local_1000 = 0;
  local_2000 = 0;
  local_3008[0].m_message.px = (element_type *)0x0;
  local_4000 = 0;
  local_5000 = 0;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  TestArgsManager::TestArgsManager((TestArgsManager *)in_stack_ffffffffffff9a98);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffff9a98);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffff9ad8,
             (AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffff9ad0,
             (char *)in_stack_ffffffffffff9ac8,(char *)in_stack_ffffffffffff9ac0,
             (int)((ulong)in_stack_ffffffffffff9ab8 >> 0x20),
             SUB81((ulong)in_stack_ffffffffffff9ab8 >> 0x18,0));
  local_1d78 = 1;
  pVar11 = std::make_pair<char_const(&)[3],ArgsManager::Flags>
                     ((char (*) [3])in_stack_ffffffffffff9ab0,(Flags *)in_stack_ffffffffffff9aa8);
  local_1d88 = pVar11.first;
  local_1d80 = pVar11.second;
  local_1d8c = 1;
  pVar11 = std::make_pair<char_const(&)[3],ArgsManager::Flags>
                     ((char (*) [3])in_stack_ffffffffffff9ab0,(Flags *)in_stack_ffffffffffff9aa8);
  local_1da0 = pVar11.first;
  local_1d98 = pVar11.second;
  local_1da4 = 1;
  pVar11 = std::make_pair<char_const(&)[5],ArgsManager::Flags>
                     ((char (*) [5])in_stack_ffffffffffff9ab0,(Flags *)in_stack_ffffffffffff9aa8);
  local_1db8 = pVar11.first;
  local_1db0 = pVar11.second;
  local_1dbc = 1;
  pVar11 = std::make_pair<char_const(&)[3],ArgsManager::Flags>
                     ((char (*) [3])in_stack_ffffffffffff9ab0,(Flags *)in_stack_ffffffffffff9aa8);
  local_1dd0 = pVar11.first;
  local_1dc8 = pVar11.second;
  local_1dd4 = 1;
  pVar11 = std::make_pair<char_const(&)[3],ArgsManager::Flags>
                     ((char (*) [3])in_stack_ffffffffffff9ab0,(Flags *)in_stack_ffffffffffff9aa8);
  local_1de8 = pVar11.first;
  local_1de0 = pVar11.second;
  local_1dec = 1;
  pVar11 = std::make_pair<char_const(&)[5],ArgsManager::Flags>
                     ((char (*) [5])in_stack_ffffffffffff9ab0,(Flags *)in_stack_ffffffffffff9aa8);
  local_1e00 = pVar11.first;
  local_1df8 = pVar11.second;
  local_1e04 = 1;
  pVar11 = std::make_pair<char_const(&)[5],ArgsManager::Flags>
                     ((char (*) [5])in_stack_ffffffffffff9ab0,(Flags *)in_stack_ffffffffffff9aa8);
  local_1e18 = pVar11.first;
  local_1e10 = pVar11.second;
  local_1e1c = 1;
  pVar11 = std::make_pair<char_const(&)[3],ArgsManager::Flags>
                     ((char (*) [3])in_stack_ffffffffffff9ab0,(Flags *)in_stack_ffffffffffff9aa8);
  local_1e30 = pVar11.first;
  local_1e28 = pVar11.second;
  local_1e34 = 1;
  pVar11 = std::make_pair<char_const(&)[3],ArgsManager::Flags>
                     ((char (*) [3])in_stack_ffffffffffff9ab0,(Flags *)in_stack_ffffffffffff9aa8);
  local_1e48 = pVar11.first;
  local_1e40 = pVar11.second;
  local_1e4c = 1;
  pVar11 = std::make_pair<char_const(&)[5],ArgsManager::Flags>
                     ((char (*) [5])in_stack_ffffffffffff9ab0,(Flags *)in_stack_ffffffffffff9aa8);
  local_1e60 = pVar11.first;
  local_1e58 = pVar11.second;
  iii.first = local_1e60;
  iii.second = local_1e58;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_*,_ArgsManager::Flags,_true>
            (in_stack_ffffffffffff9ad0,
             (pair<const_char_*,_ArgsManager::Flags> *)in_stack_ffffffffffff9ac8);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_*,_ArgsManager::Flags,_true>
            (in_stack_ffffffffffff9ad0,
             (pair<const_char_*,_ArgsManager::Flags> *)in_stack_ffffffffffff9ac8);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_*,_ArgsManager::Flags,_true>
            (in_stack_ffffffffffff9ad0,
             (pair<const_char_*,_ArgsManager::Flags> *)in_stack_ffffffffffff9ac8);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_*,_ArgsManager::Flags,_true>
            (in_stack_ffffffffffff9ad0,
             (pair<const_char_*,_ArgsManager::Flags> *)in_stack_ffffffffffff9ac8);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_*,_ArgsManager::Flags,_true>
            (in_stack_ffffffffffff9ad0,
             (pair<const_char_*,_ArgsManager::Flags> *)in_stack_ffffffffffff9ac8);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_*,_ArgsManager::Flags,_true>
            (in_stack_ffffffffffff9ad0,
             (pair<const_char_*,_ArgsManager::Flags> *)in_stack_ffffffffffff9ac8);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_*,_ArgsManager::Flags,_true>
            (in_stack_ffffffffffff9ad0,
             (pair<const_char_*,_ArgsManager::Flags> *)in_stack_ffffffffffff9ac8);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_*,_ArgsManager::Flags,_true>
            (in_stack_ffffffffffff9ad0,
             (pair<const_char_*,_ArgsManager::Flags> *)in_stack_ffffffffffff9ac8);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_*,_ArgsManager::Flags,_true>
            (in_stack_ffffffffffff9ad0,
             (pair<const_char_*,_ArgsManager::Flags> *)in_stack_ffffffffffff9ac8);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_*,_ArgsManager::Flags,_true>
            (in_stack_ffffffffffff9ad0,
             (pair<const_char_*,_ArgsManager::Flags> *)in_stack_ffffffffffff9ac8);
  std::
  allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  ::allocator((allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
               *)in_stack_ffffffffffff9a98);
  __l._M_len._0_4_ = in_stack_ffffffffffff9ae8;
  __l._M_array = (iterator)in_stack_ffffffffffff9ae0;
  __l._M_len._4_4_ = in_stack_ffffffffffff9aec;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
            *)in_stack_ffffffffffff9ad8,__l,(allocator_type *)in_stack_ffffffffffff9ad0);
  TestArgsManager::SetupArgs
            ((TestArgsManager *)in_stack_ffffffffffff9ae0,
             (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
              *)in_stack_ffffffffffff9ad8);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             *)in_stack_ffffffffffff9aa8);
  std::
  allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  ::~allocator((allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
                *)in_stack_ffffffffffff9a98);
  local_5290 = (path *)&test_args;
  do {
    local_5290 = local_5290 + -1;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
             *)in_stack_ffffffffffff9a98);
  } while (local_5290 != (path *)local_3e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
             (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
  TestArgsManager::ReadConfigString
            ((TestArgsManager *)CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
             in_stack_ffffffffffff9ae0);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffff9a98);
  std::allocator<char>::~allocator(local_1e7a);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffff9ad8,
               (const_string *)in_stack_ffffffffffff9ad0,(size_t)in_stack_ffffffffffff9ac8,
               (const_string *)in_stack_ffffffffffff9ac0);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
    ::empty((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
             *)in_stack_ffffffffffff9a98);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffff9aa8,
               SUB81((ulong)in_stack_ffffffffffff9aa0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffff9aa0,
               (basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    in_stack_ffffffffffff9a98 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1eb8,local_1ed8,local_1ef8,0x1c9,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffff9a98);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffff9a98);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffff9ad8,
               (const_string *)in_stack_ffffffffffff9ad0,(size_t)in_stack_ffffffffffff9ac8,
               (const_string *)in_stack_ffffffffffff9ac0);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>_>_>_>
    ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>_>_>_>
            *)in_stack_ffffffffffff9a98);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffff9aa8,
               SUB81((ulong)in_stack_ffffffffffff9aa0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffff9aa0,
               (basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    in_stack_ffffffffffff9a98 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1f30,local_1f50,local_1f70,0x1ca,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffff9a98);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffff9a98);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffff9ad8,
               (const_string *)in_stack_ffffffffffff9ad0,(size_t)in_stack_ffffffffffff9ac8,
               (const_string *)in_stack_ffffffffffff9ac0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
               (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>_>_>_>
    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>_>_>_>
                  *)in_stack_ffffffffffff9ac0,(key_type *)in_stack_ffffffffffff9ab8);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
    ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
            *)in_stack_ffffffffffff9a98);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffff9aa8,
               SUB81((ulong)in_stack_ffffffffffff9aa0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffff9aa0,
               (basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    in_stack_ffffffffffff9a98 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1fa8,local_1fd0,local_1ff0,0x1cb,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffff9a98);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffff9a98);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::allocator<char>::~allocator(&local_1fa9);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffff9ad8,
               (const_string *)in_stack_ffffffffffff9ad0,(size_t)in_stack_ffffffffffff9ac8,
               (const_string *)in_stack_ffffffffffff9ac0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
               (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>_>_>_>
    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>_>_>_>
                  *)in_stack_ffffffffffff9ac0,(key_type *)in_stack_ffffffffffff9ab8);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
    ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
            *)in_stack_ffffffffffff9a98);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffff9aa8,
               SUB81((ulong)in_stack_ffffffffffff9aa0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffff9aa0,
               (basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    in_stack_ffffffffffff9a98 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_2028,local_2050,local_2070,0x1cc,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffff9a98);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffff9a98);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::allocator<char>::~allocator(&local_2029);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffff9ad8,
               (const_string *)in_stack_ffffffffffff9ad0,(size_t)in_stack_ffffffffffff9ac8,
               (const_string *)in_stack_ffffffffffff9ac0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
               (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>_>_>_>
    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>_>_>_>
                  *)in_stack_ffffffffffff9ac0,(key_type *)in_stack_ffffffffffff9ab8);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
    ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
            *)in_stack_ffffffffffff9a98);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffff9aa8,
               SUB81((ulong)in_stack_ffffffffffff9aa0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffff9aa0,
               (basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    in_stack_ffffffffffff9a98 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_20a8,local_20d0,local_20f0,0x1cd,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffff9a98);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffff9a98);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::allocator<char>::~allocator(&local_20a9);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffff9ad8,
               (const_string *)in_stack_ffffffffffff9ad0,(size_t)in_stack_ffffffffffff9ac8,
               (const_string *)in_stack_ffffffffffff9ac0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
               (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>_>_>_>
    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>_>_>_>
                  *)in_stack_ffffffffffff9ac0,(key_type *)in_stack_ffffffffffff9ab8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
               (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
    local_2130 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
                 ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
                          *)in_stack_ffffffffffff9aa8,(key_type *)in_stack_ffffffffffff9aa0);
    boost::test_tools::assertion_result::assertion_result<unsigned_long>
              ((assertion_result *)in_stack_ffffffffffff9aa8,
               (unsigned_long *)in_stack_ffffffffffff9aa0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffff9aa0,
               (basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    in_stack_ffffffffffff9a98 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_2128,local_2158,local_2178,0x1cf,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffff9a98);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffff9a98);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::allocator<char>::~allocator(&local_2132);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::allocator<char>::~allocator(&local_2131);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffff9ad8,
               (const_string *)in_stack_ffffffffffff9ad0,(size_t)in_stack_ffffffffffff9ac8,
               (const_string *)in_stack_ffffffffffff9ac0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
               (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>_>_>_>
    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>_>_>_>
                  *)in_stack_ffffffffffff9ac0,(key_type *)in_stack_ffffffffffff9ab8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
               (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
    local_21b8 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
                 ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
                          *)in_stack_ffffffffffff9aa8,(key_type *)in_stack_ffffffffffff9aa0);
    boost::test_tools::assertion_result::assertion_result<unsigned_long>
              ((assertion_result *)in_stack_ffffffffffff9aa8,
               (unsigned_long *)in_stack_ffffffffffff9aa0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffff9aa0,
               (basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    in_stack_ffffffffffff9a98 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_21b0,local_21e0,local_2200,0x1d0,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffff9a98);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffff9a98);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::allocator<char>::~allocator(&local_21ba);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::allocator<char>::~allocator(&local_21b9);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffff9ad8,
               (const_string *)in_stack_ffffffffffff9ad0,(size_t)in_stack_ffffffffffff9ac8,
               (const_string *)in_stack_ffffffffffff9ac0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
               (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>_>_>_>
    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>_>_>_>
                  *)in_stack_ffffffffffff9ac0,(key_type *)in_stack_ffffffffffff9ab8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
               (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
    local_2240 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
                 ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
                          *)in_stack_ffffffffffff9aa8,(key_type *)in_stack_ffffffffffff9aa0);
    boost::test_tools::assertion_result::assertion_result<unsigned_long>
              ((assertion_result *)in_stack_ffffffffffff9aa8,
               (unsigned_long *)in_stack_ffffffffffff9aa0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffff9aa0,
               (basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    in_stack_ffffffffffff9a98 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_2238,local_2268,local_2288,0x1d1,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffff9a98);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffff9a98);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::allocator<char>::~allocator(&local_2242);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::allocator<char>::~allocator(&local_2241);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffff9ad8,
               (const_string *)in_stack_ffffffffffff9ad0,(size_t)in_stack_ffffffffffff9ac8,
               (const_string *)in_stack_ffffffffffff9ac0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
               (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>_>_>_>
    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>_>_>_>
                  *)in_stack_ffffffffffff9ac0,(key_type *)in_stack_ffffffffffff9ab8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
               (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
    local_22c8 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
                 ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
                          *)in_stack_ffffffffffff9aa8,(key_type *)in_stack_ffffffffffff9aa0);
    boost::test_tools::assertion_result::assertion_result<unsigned_long>
              ((assertion_result *)in_stack_ffffffffffff9aa8,
               (unsigned_long *)in_stack_ffffffffffff9aa0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffff9aa0,
               (basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    in_stack_ffffffffffff9a98 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_22c0,local_22f0,local_2310,0x1d2,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffff9a98);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffff9a98);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::allocator<char>::~allocator(&local_22ca);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::allocator<char>::~allocator(&local_22c9);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffff9ad8,
               (const_string *)in_stack_ffffffffffff9ad0,(size_t)in_stack_ffffffffffff9ac8,
               (const_string *)in_stack_ffffffffffff9ac0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
               (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>_>_>_>
    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>_>_>_>
                  *)in_stack_ffffffffffff9ac0,(key_type *)in_stack_ffffffffffff9ab8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
               (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
    local_2350 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
                 ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
                          *)in_stack_ffffffffffff9aa8,(key_type *)in_stack_ffffffffffff9aa0);
    boost::test_tools::assertion_result::assertion_result<unsigned_long>
              ((assertion_result *)in_stack_ffffffffffff9aa8,
               (unsigned_long *)in_stack_ffffffffffff9aa0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffff9aa0,
               (basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    in_stack_ffffffffffff9a98 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_2348,local_2378,local_2398,0x1d3,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffff9a98);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffff9a98);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::allocator<char>::~allocator(&local_2352);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::allocator<char>::~allocator(&local_2351);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffff9ad8,
               (const_string *)in_stack_ffffffffffff9ad0,(size_t)in_stack_ffffffffffff9ac8,
               (const_string *)in_stack_ffffffffffff9ac0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
               (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>_>_>_>
    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>_>_>_>
                  *)in_stack_ffffffffffff9ac0,(key_type *)in_stack_ffffffffffff9ab8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
               (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
    local_23d8 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
                 ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
                          *)in_stack_ffffffffffff9aa8,(key_type *)in_stack_ffffffffffff9aa0);
    boost::test_tools::assertion_result::assertion_result<unsigned_long>
              ((assertion_result *)in_stack_ffffffffffff9aa8,
               (unsigned_long *)in_stack_ffffffffffff9aa0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffff9aa0,
               (basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    in_stack_ffffffffffff9a98 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_23d0,local_2400,local_2420,0x1d4,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffff9a98);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffff9a98);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::allocator<char>::~allocator(&local_23da);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::allocator<char>::~allocator(&local_23d9);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffff9ad8,
               (const_string *)in_stack_ffffffffffff9ad0,(size_t)in_stack_ffffffffffff9ac8,
               (const_string *)in_stack_ffffffffffff9ac0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
               (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>_>_>_>
    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>_>_>_>
                  *)in_stack_ffffffffffff9ac0,(key_type *)in_stack_ffffffffffff9ab8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
               (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
    local_2460 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
                 ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
                          *)in_stack_ffffffffffff9aa8,(key_type *)in_stack_ffffffffffff9aa0);
    boost::test_tools::assertion_result::assertion_result<unsigned_long>
              ((assertion_result *)in_stack_ffffffffffff9aa8,
               (unsigned_long *)in_stack_ffffffffffff9aa0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffff9aa0,
               (basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    in_stack_ffffffffffff9a98 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_2458,local_2488,local_24a8,0x1d5,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffff9a98);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffff9a98);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::allocator<char>::~allocator(&local_2462);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::allocator<char>::~allocator(&local_2461);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffff9ad8,
               (const_string *)in_stack_ffffffffffff9ad0,(size_t)in_stack_ffffffffffff9ac8,
               (const_string *)in_stack_ffffffffffff9ac0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
               (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>_>_>_>
    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>_>_>_>
                  *)in_stack_ffffffffffff9ac0,(key_type *)in_stack_ffffffffffff9ab8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
               (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
    local_24e8 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
                 ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
                          *)in_stack_ffffffffffff9aa8,(key_type *)in_stack_ffffffffffff9aa0);
    boost::test_tools::assertion_result::assertion_result<unsigned_long>
              ((assertion_result *)in_stack_ffffffffffff9aa8,
               (unsigned_long *)in_stack_ffffffffffff9aa0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffff9aa0,
               (basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    in_stack_ffffffffffff9a98 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_24e0,local_2510,local_2530,0x1d6,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffff9a98);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffff9a98);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::allocator<char>::~allocator(&local_24ea);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::allocator<char>::~allocator(&local_24e9);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffff9ad8,
               (const_string *)in_stack_ffffffffffff9ad0,(size_t)in_stack_ffffffffffff9ac8,
               (const_string *)in_stack_ffffffffffff9ac0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
               (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>_>_>_>
    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>_>_>_>
                  *)in_stack_ffffffffffff9ac0,(key_type *)in_stack_ffffffffffff9ab8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
               (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
    local_2570 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
                 ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
                          *)in_stack_ffffffffffff9aa8,(key_type *)in_stack_ffffffffffff9aa0);
    boost::test_tools::assertion_result::assertion_result<unsigned_long>
              ((assertion_result *)in_stack_ffffffffffff9aa8,
               (unsigned_long *)in_stack_ffffffffffff9aa0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffff9aa0,
               (basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    in_stack_ffffffffffff9a98 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_2568,local_2598,local_25b8,0x1d7,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffff9a98);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffff9a98);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::allocator<char>::~allocator(&local_2572);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::allocator<char>::~allocator(&local_2571);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffff9ad8,
               (const_string *)in_stack_ffffffffffff9ad0,(size_t)in_stack_ffffffffffff9ac8,
               (const_string *)in_stack_ffffffffffff9ac0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
               (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>_>_>_>
    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>_>_>_>
                  *)in_stack_ffffffffffff9ac0,(key_type *)in_stack_ffffffffffff9ab8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
               (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
    local_25f8 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
                 ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
                          *)in_stack_ffffffffffff9aa8,(key_type *)in_stack_ffffffffffff9aa0);
    boost::test_tools::assertion_result::assertion_result<unsigned_long>
              ((assertion_result *)in_stack_ffffffffffff9aa8,
               (unsigned_long *)in_stack_ffffffffffff9aa0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffff9aa0,
               (basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    in_stack_ffffffffffff9a98 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_25f0,local_2620,local_2640,0x1d8,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffff9a98);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffff9a98);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::allocator<char>::~allocator(&local_25fa);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::allocator<char>::~allocator(&local_25f9);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffff9ad8,
               (const_string *)in_stack_ffffffffffff9ad0,(size_t)in_stack_ffffffffffff9ac8,
               (const_string *)in_stack_ffffffffffff9ac0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
               (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>_>_>_>
    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>_>_>_>
                  *)in_stack_ffffffffffff9ac0,(key_type *)in_stack_ffffffffffff9ab8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
               (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
    local_2680 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
                 ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
                          *)in_stack_ffffffffffff9aa8,(key_type *)in_stack_ffffffffffff9aa0);
    boost::test_tools::assertion_result::assertion_result<unsigned_long>
              ((assertion_result *)in_stack_ffffffffffff9aa8,
               (unsigned_long *)in_stack_ffffffffffff9aa0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffff9aa0,
               (basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    in_stack_ffffffffffff9a98 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_2678,local_26a8,local_26c8,0x1d9,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffff9a98);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffff9a98);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::allocator<char>::~allocator(&local_2682);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::allocator<char>::~allocator(&local_2681);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffff9ad8,
               (const_string *)in_stack_ffffffffffff9ad0,(size_t)in_stack_ffffffffffff9ac8,
               (const_string *)in_stack_ffffffffffff9ac0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
               (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>_>_>_>
    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>_>_>_>
                  *)in_stack_ffffffffffff9ac0,(key_type *)in_stack_ffffffffffff9ab8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
               (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
    local_2708 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
                 ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
                          *)in_stack_ffffffffffff9aa8,(key_type *)in_stack_ffffffffffff9aa0);
    boost::test_tools::assertion_result::assertion_result<unsigned_long>
              ((assertion_result *)in_stack_ffffffffffff9aa8,
               (unsigned_long *)in_stack_ffffffffffff9aa0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffff9aa0,
               (basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    in_stack_ffffffffffff9a98 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_2700,local_2730,local_2750,0x1da,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffff9a98);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffff9a98);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::allocator<char>::~allocator(&local_270a);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::allocator<char>::~allocator(&local_2709);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffff9ad8,
               (const_string *)in_stack_ffffffffffff9ad0,(size_t)in_stack_ffffffffffff9ac8,
               (const_string *)in_stack_ffffffffffff9ac0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
               (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
    ArgsManager::IsArgSet(in_stack_ffffffffffff9ac0,(string *)in_stack_ffffffffffff9ab8);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffff9aa8,
               SUB81((ulong)in_stack_ffffffffffff9aa0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffff9aa0,
               (basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    in_stack_ffffffffffff9a98 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_2788,local_27b0,local_27d0,0x1dc,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffff9a98);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffff9a98);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::allocator<char>::~allocator(&local_2789);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffff9ad8,
               (const_string *)in_stack_ffffffffffff9ad0,(size_t)in_stack_ffffffffffff9ac8,
               (const_string *)in_stack_ffffffffffff9ac0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
               (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
    ArgsManager::IsArgSet(in_stack_ffffffffffff9ac0,(string *)in_stack_ffffffffffff9ab8);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffff9aa8,
               SUB81((ulong)in_stack_ffffffffffff9aa0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffff9aa0,
               (basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    in_stack_ffffffffffff9a98 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_2808,local_2830,local_2850,0x1dd,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffff9a98);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffff9a98);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::allocator<char>::~allocator(&local_2809);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffff9ad8,
               (const_string *)in_stack_ffffffffffff9ad0,(size_t)in_stack_ffffffffffff9ac8,
               (const_string *)in_stack_ffffffffffff9ac0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
               (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
    ArgsManager::IsArgSet(in_stack_ffffffffffff9ac0,(string *)in_stack_ffffffffffff9ab8);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffff9aa8,
               SUB81((ulong)in_stack_ffffffffffff9aa0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffff9aa0,
               (basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    in_stack_ffffffffffff9a98 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_2888,local_28b0,local_28d0,0x1de,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffff9a98);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffff9a98);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::allocator<char>::~allocator(&local_2889);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffff9ad8,
               (const_string *)in_stack_ffffffffffff9ad0,(size_t)in_stack_ffffffffffff9ac8,
               (const_string *)in_stack_ffffffffffff9ac0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
               (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
    ArgsManager::IsArgSet(in_stack_ffffffffffff9ac0,(string *)in_stack_ffffffffffff9ab8);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffff9aa8,
               SUB81((ulong)in_stack_ffffffffffff9aa0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffff9aa0,
               (basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    in_stack_ffffffffffff9a98 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_2908,local_2930,local_2950,0x1df,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffff9a98);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffff9a98);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::allocator<char>::~allocator(&local_2909);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffff9ad8,
               (const_string *)in_stack_ffffffffffff9ad0,(size_t)in_stack_ffffffffffff9ac8,
               (const_string *)in_stack_ffffffffffff9ac0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
               (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
    ArgsManager::IsArgSet(in_stack_ffffffffffff9ac0,(string *)in_stack_ffffffffffff9ab8);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffff9aa8,
               SUB81((ulong)in_stack_ffffffffffff9aa0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffff9aa0,
               (basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    in_stack_ffffffffffff9a98 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_2988,local_29b0,local_29d0,0x1e0,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffff9a98);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffff9a98);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::allocator<char>::~allocator(&local_2989);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffff9ad8,
               (const_string *)in_stack_ffffffffffff9ad0,(size_t)in_stack_ffffffffffff9ac8,
               (const_string *)in_stack_ffffffffffff9ac0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
               (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
    ArgsManager::IsArgSet(in_stack_ffffffffffff9ac0,(string *)in_stack_ffffffffffff9ab8);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffff9aa8,
               SUB81((ulong)in_stack_ffffffffffff9aa0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffff9aa0,
               (basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    in_stack_ffffffffffff9a98 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_2a08,local_2a30,local_2a50,0x1e1,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffff9a98);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffff9a98);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::allocator<char>::~allocator(&local_2a09);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffff9ad8,
               (const_string *)in_stack_ffffffffffff9ad0,(size_t)in_stack_ffffffffffff9ac8,
               (const_string *)in_stack_ffffffffffff9ac0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
               (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
    ArgsManager::IsArgSet(in_stack_ffffffffffff9ac0,(string *)in_stack_ffffffffffff9ab8);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffff9aa8,
               SUB81((ulong)in_stack_ffffffffffff9aa0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffff9aa0,
               (basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    in_stack_ffffffffffff9a98 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_2a88,local_2ab0,local_2ad0,0x1e2,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffff9a98);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffff9a98);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::allocator<char>::~allocator(&local_2a89);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffff9ad8,
               (const_string *)in_stack_ffffffffffff9ad0,(size_t)in_stack_ffffffffffff9ac8,
               (const_string *)in_stack_ffffffffffff9ac0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
               (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
    ArgsManager::IsArgSet(in_stack_ffffffffffff9ac0,(string *)in_stack_ffffffffffff9ab8);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffff9aa8,
               SUB81((ulong)in_stack_ffffffffffff9aa0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffff9aa0,
               (basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    in_stack_ffffffffffff9a98 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_2b08,local_2b30,local_2b50,0x1e3,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffff9a98);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffff9a98);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::allocator<char>::~allocator(&local_2b09);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffff9ad8,
               (const_string *)in_stack_ffffffffffff9ad0,(size_t)in_stack_ffffffffffff9ac8,
               (const_string *)in_stack_ffffffffffff9ac0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
               (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
    ArgsManager::IsArgSet(in_stack_ffffffffffff9ac0,(string *)in_stack_ffffffffffff9ab8);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffff9aa8,
               SUB81((ulong)in_stack_ffffffffffff9aa0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffff9aa0,
               (basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    in_stack_ffffffffffff9a98 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_2b88,local_2bb0,local_2bd0,0x1e4,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffff9a98);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffff9a98);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::allocator<char>::~allocator(&local_2b89);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffff9ad8,
               (const_string *)in_stack_ffffffffffff9ad0,(size_t)in_stack_ffffffffffff9ac8,
               (const_string *)in_stack_ffffffffffff9ac0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
               (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
    ArgsManager::IsArgSet(in_stack_ffffffffffff9ac0,(string *)in_stack_ffffffffffff9ab8);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffff9aa8,
               SUB81((ulong)in_stack_ffffffffffff9aa0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffff9aa0,
               (basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    in_stack_ffffffffffff9a98 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_2c08,local_2c30,local_2c50,0x1e5,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffff9a98);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffff9a98);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::allocator<char>::~allocator(&local_2c09);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffff9ad8,
               (const_string *)in_stack_ffffffffffff9ad0,(size_t)in_stack_ffffffffffff9ac8,
               (const_string *)in_stack_ffffffffffff9ac0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffff9aa0,(char (*) [1])in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
               (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
               (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
    ArgsManager::GetArg(in_stack_ffffffffffff9ad8,&in_stack_ffffffffffff9ad0->first,
                        in_stack_ffffffffffff9ac8);
    in_stack_ffffffffffff9aa8 = "\"\"";
    in_stack_ffffffffffff9aa0 = "";
    in_stack_ffffffffffff9a98 = "test_args.GetArg(\"-a\", \"xxx\")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[1]>
              (local_2c90,local_2ca0,0x1e7,1,2,local_8c0);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::allocator<char>::~allocator(&local_2ca2);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::allocator<char>::~allocator(&local_2ca1);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffff9a98);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffff9ad8,
               (const_string *)in_stack_ffffffffffff9ad0,(size_t)in_stack_ffffffffffff9ac8,
               (const_string *)in_stack_ffffffffffff9ac0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffff9aa0,(char (*) [1])in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
               (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
               (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
    ArgsManager::GetArg(in_stack_ffffffffffff9ad8,&in_stack_ffffffffffff9ad0->first,
                        in_stack_ffffffffffff9ac8);
    in_stack_ffffffffffff9aa8 = "\"1\"";
    in_stack_ffffffffffff9aa0 = "1";
    in_stack_ffffffffffff9a98 = "test_args.GetArg(\"-b\", \"xxx\")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[2]>
              (local_2ce8,local_2cf8,0x1e8,1,2,local_920);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::allocator<char>::~allocator(&local_2cfa);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::allocator<char>::~allocator(&local_2cf9);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffff9a98);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffff9ad8,
               (const_string *)in_stack_ffffffffffff9ad0,(size_t)in_stack_ffffffffffff9ac8,
               (const_string *)in_stack_ffffffffffff9ac0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffff9aa0,(char (*) [1])in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
               (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
               (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
    ArgsManager::GetArg(in_stack_ffffffffffff9ad8,&in_stack_ffffffffffff9ad0->first,
                        in_stack_ffffffffffff9ac8);
    in_stack_ffffffffffff9aa8 = "\"argument\"";
    in_stack_ffffffffffff9aa0 = "argument";
    in_stack_ffffffffffff9a98 = "test_args.GetArg(\"-ccc\", \"xxx\")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[9]>
              (local_2d40,local_2d50,0x1e9,1,2,local_980);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::allocator<char>::~allocator(&local_2d52);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::allocator<char>::~allocator(&local_2d51);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffff9a98);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffff9ad8,
               (const_string *)in_stack_ffffffffffff9ad0,(size_t)in_stack_ffffffffffff9ac8,
               (const_string *)in_stack_ffffffffffff9ac0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffff9aa0,(char (*) [1])in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
               (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
               (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
    ArgsManager::GetArg(in_stack_ffffffffffff9ad8,&in_stack_ffffffffffff9ad0->first,
                        in_stack_ffffffffffff9ac8);
    in_stack_ffffffffffff9aa8 = "\"e\"";
    in_stack_ffffffffffff9aa0 = "e";
    in_stack_ffffffffffff9a98 = "test_args.GetArg(\"-d\", \"xxx\")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[2]>
              (local_2d98,local_2da8,0x1ea,1,2,local_9e0);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::allocator<char>::~allocator(&local_2daa);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::allocator<char>::~allocator(&local_2da9);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffff9a98);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffff9ad8,
               (const_string *)in_stack_ffffffffffff9ad0,(size_t)in_stack_ffffffffffff9ac8,
               (const_string *)in_stack_ffffffffffff9ac0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffff9aa0,(char (*) [1])in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
               (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
               (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
    ArgsManager::GetArg(in_stack_ffffffffffff9ad8,&in_stack_ffffffffffff9ad0->first,
                        in_stack_ffffffffffff9ac8);
    in_stack_ffffffffffff9aa8 = "\"0\"";
    in_stack_ffffffffffff9aa0 = "0";
    in_stack_ffffffffffff9a98 = "test_args.GetArg(\"-fff\", \"xxx\")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[2]>
              (local_2df0,local_2e00,0x1eb,1,2,local_a40);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::allocator<char>::~allocator(&local_2e02);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::allocator<char>::~allocator(&local_2e01);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffff9a98);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffff9ad8,
               (const_string *)in_stack_ffffffffffff9ad0,(size_t)in_stack_ffffffffffff9ac8,
               (const_string *)in_stack_ffffffffffff9ac0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffff9aa0,(char (*) [1])in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
               (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
               (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
    ArgsManager::GetArg(in_stack_ffffffffffff9ad8,&in_stack_ffffffffffff9ad0->first,
                        in_stack_ffffffffffff9ac8);
    in_stack_ffffffffffff9aa8 = "\"1\"";
    in_stack_ffffffffffff9aa0 = "1";
    in_stack_ffffffffffff9a98 = "test_args.GetArg(\"-ggg\", \"xxx\")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[2]>
              (local_2e48,local_2e58,0x1ec,1,2,local_aa0);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::allocator<char>::~allocator(&local_2e5a);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::allocator<char>::~allocator(&local_2e59);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffff9a98);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffff9ad8,
               (const_string *)in_stack_ffffffffffff9ad0,(size_t)in_stack_ffffffffffff9ac8,
               (const_string *)in_stack_ffffffffffff9ac0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffff9aa0,(char (*) [1])in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
               (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
               (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
    ArgsManager::GetArg(in_stack_ffffffffffff9ad8,&in_stack_ffffffffffff9ad0->first,
                        in_stack_ffffffffffff9ac8);
    in_stack_ffffffffffff9aa8 = "\"0\"";
    in_stack_ffffffffffff9aa0 = "0";
    in_stack_ffffffffffff9a98 = "test_args.GetArg(\"-h\", \"xxx\")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[2]>
              (local_2ea0,local_2eb0,0x1ed,1,2,local_b00);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::allocator<char>::~allocator(&local_2eb2);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::allocator<char>::~allocator(&local_2eb1);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffff9a98);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffff9ad8,
               (const_string *)in_stack_ffffffffffff9ad0,(size_t)in_stack_ffffffffffff9ac8,
               (const_string *)in_stack_ffffffffffff9ac0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffff9aa0,(char (*) [1])in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
               (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
               (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
    ArgsManager::GetArg(in_stack_ffffffffffff9ad8,&in_stack_ffffffffffff9ad0->first,
                        in_stack_ffffffffffff9ac8);
    in_stack_ffffffffffff9aa8 = "\"1\"";
    in_stack_ffffffffffff9aa0 = "1";
    in_stack_ffffffffffff9a98 = "test_args.GetArg(\"-i\", \"xxx\")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[2]>
              (local_2ef8,local_2f08,0x1ee,1,2,local_b60);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::allocator<char>::~allocator(&local_2f0a);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::allocator<char>::~allocator(&local_2f09);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffff9a98);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffff9ad8,
               (const_string *)in_stack_ffffffffffff9ad0,(size_t)in_stack_ffffffffffff9ac8,
               (const_string *)in_stack_ffffffffffff9ac0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffff9aa0,(char (*) [1])in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
               (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
               (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
    ArgsManager::GetArg(in_stack_ffffffffffff9ad8,&in_stack_ffffffffffff9ad0->first,
                        in_stack_ffffffffffff9ac8);
    in_stack_ffffffffffff9aa8 = "\"xxx\"";
    in_stack_ffffffffffff9aa0 = "xxx";
    in_stack_ffffffffffff9a98 = "test_args.GetArg(\"-zzz\", \"xxx\")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[4]>
              (local_2f50,local_2f60,0x1ef,1,2,local_bc0);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::allocator<char>::~allocator(&local_2f62);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::allocator<char>::~allocator(&local_2f61);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffff9a98);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffff9ad8,
               (const_string *)in_stack_ffffffffffff9ad0,(size_t)in_stack_ffffffffffff9ac8,
               (const_string *)in_stack_ffffffffffff9ac0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffff9aa0,(char (*) [1])in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
               (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
               (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
    ArgsManager::GetArg(in_stack_ffffffffffff9ad8,&in_stack_ffffffffffff9ad0->first,
                        in_stack_ffffffffffff9ac8);
    in_stack_ffffffffffff9aa8 = "\"xxx\"";
    in_stack_ffffffffffff9aa0 = "xxx";
    in_stack_ffffffffffff9a98 = "test_args.GetArg(\"-iii\", \"xxx\")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[4]>
              (local_2fa8,local_2fb8,0x1f0,1,2,local_c20);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::allocator<char>::~allocator(&local_2fba);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::allocator<char>::~allocator(&local_2fb9);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffff9a98);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  local_1d72 = 0;
  local_1d71 = 1;
  local_2fd0 = &local_1d72;
  local_2fc8 = 2;
  __begin1 = std::initializer_list<bool>::begin((initializer_list<bool> *)in_stack_ffffffffffff9a98)
  ;
  pbVar9 = std::initializer_list<bool>::end((initializer_list<bool> *)in_stack_ffffffffffff9aa8);
  for (; __begin1 != pbVar9; __begin1 = __begin1 + 1) {
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
                 (unsigned_long)in_stack_ffffffffffff9a98);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffff9ad8,
                 (const_string *)in_stack_ffffffffffff9ad0,(size_t)in_stack_ffffffffffff9ac8,
                 (const_string *)in_stack_ffffffffffff9ac0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
                 (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
      ArgsManager::GetBoolArg
                ((ArgsManager *)in_stack_ffffffffffff9aa0,(string *)in_stack_ffffffffffff9a98,
                 SUB81((ulong)in_stack_ffffffffffff9aa8 >> 0x38,0));
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffff9aa8,
                 SUB81((ulong)in_stack_ffffffffffff9aa0 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
                 (unsigned_long)in_stack_ffffffffffff9a98);
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffff9aa0,
                 (basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
                 (unsigned_long)in_stack_ffffffffffff9a98);
      in_stack_ffffffffffff9a98 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_3008,local_3030,local_3050,499,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_ffffffffffff9a98);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffff9a98);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffff9a98);
      std::allocator<char>::~allocator(&local_3009);
      bVar7 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar7);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
                 (unsigned_long)in_stack_ffffffffffff9a98);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffff9ad8,
                 (const_string *)in_stack_ffffffffffff9ad0,(size_t)in_stack_ffffffffffff9ac8,
                 (const_string *)in_stack_ffffffffffff9ac0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
                 (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
      ArgsManager::GetBoolArg
                ((ArgsManager *)in_stack_ffffffffffff9aa0,(string *)in_stack_ffffffffffff9a98,
                 SUB81((ulong)in_stack_ffffffffffff9aa8 >> 0x38,0));
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffff9aa8,
                 SUB81((ulong)in_stack_ffffffffffff9aa0 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
                 (unsigned_long)in_stack_ffffffffffff9a98);
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffff9aa0,
                 (basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
                 (unsigned_long)in_stack_ffffffffffff9a98);
      in_stack_ffffffffffff9a98 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_3088,local_30b0,local_30d0,500,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_ffffffffffff9a98);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffff9a98);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffff9a98);
      std::allocator<char>::~allocator(&local_3089);
      bVar7 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar7);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
                 (unsigned_long)in_stack_ffffffffffff9a98);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffff9ad8,
                 (const_string *)in_stack_ffffffffffff9ad0,(size_t)in_stack_ffffffffffff9ac8,
                 (const_string *)in_stack_ffffffffffff9ac0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
                 (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
      ArgsManager::GetBoolArg
                ((ArgsManager *)in_stack_ffffffffffff9aa0,(string *)in_stack_ffffffffffff9a98,
                 SUB81((ulong)in_stack_ffffffffffff9aa8 >> 0x38,0));
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffff9aa8,
                 SUB81((ulong)in_stack_ffffffffffff9aa0 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
                 (unsigned_long)in_stack_ffffffffffff9a98);
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffff9aa0,
                 (basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
                 (unsigned_long)in_stack_ffffffffffff9a98);
      in_stack_ffffffffffff9a98 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_3108,local_3130,local_3150,0x1f5,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_ffffffffffff9a98);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffff9a98);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffff9a98);
      std::allocator<char>::~allocator(&local_3109);
      bVar7 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar7);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
                 (unsigned_long)in_stack_ffffffffffff9a98);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffff9ad8,
                 (const_string *)in_stack_ffffffffffff9ad0,(size_t)in_stack_ffffffffffff9ac8,
                 (const_string *)in_stack_ffffffffffff9ac0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
                 (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
      ArgsManager::GetBoolArg
                ((ArgsManager *)in_stack_ffffffffffff9aa0,(string *)in_stack_ffffffffffff9a98,
                 SUB81((ulong)in_stack_ffffffffffff9aa8 >> 0x38,0));
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffff9aa8,
                 SUB81((ulong)in_stack_ffffffffffff9aa0 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
                 (unsigned_long)in_stack_ffffffffffff9a98);
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffff9aa0,
                 (basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
                 (unsigned_long)in_stack_ffffffffffff9a98);
      in_stack_ffffffffffff9a98 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_3188,local_31b0,local_31d0,0x1f6,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_ffffffffffff9a98);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffff9a98);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffff9a98);
      std::allocator<char>::~allocator(&local_3189);
      bVar7 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar7);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
                 (unsigned_long)in_stack_ffffffffffff9a98);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffff9ad8,
                 (const_string *)in_stack_ffffffffffff9ad0,(size_t)in_stack_ffffffffffff9ac8,
                 (const_string *)in_stack_ffffffffffff9ac0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
                 (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
      ArgsManager::GetBoolArg
                ((ArgsManager *)in_stack_ffffffffffff9aa0,(string *)in_stack_ffffffffffff9a98,
                 SUB81((ulong)in_stack_ffffffffffff9aa8 >> 0x38,0));
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffff9aa8,
                 SUB81((ulong)in_stack_ffffffffffff9aa0 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
                 (unsigned_long)in_stack_ffffffffffff9a98);
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffff9aa0,
                 (basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
                 (unsigned_long)in_stack_ffffffffffff9a98);
      in_stack_ffffffffffff9a98 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_3208,local_3230,local_3250,0x1f7,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_ffffffffffff9a98);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffff9a98);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffff9a98);
      std::allocator<char>::~allocator(&local_3209);
      bVar7 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar7);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
                 (unsigned_long)in_stack_ffffffffffff9a98);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffff9ad8,
                 (const_string *)in_stack_ffffffffffff9ad0,(size_t)in_stack_ffffffffffff9ac8,
                 (const_string *)in_stack_ffffffffffff9ac0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
                 (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
      ArgsManager::GetBoolArg
                ((ArgsManager *)in_stack_ffffffffffff9aa0,(string *)in_stack_ffffffffffff9a98,
                 SUB81((ulong)in_stack_ffffffffffff9aa8 >> 0x38,0));
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffff9aa8,
                 SUB81((ulong)in_stack_ffffffffffff9aa0 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
                 (unsigned_long)in_stack_ffffffffffff9a98);
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffff9aa0,
                 (basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
                 (unsigned_long)in_stack_ffffffffffff9a98);
      in_stack_ffffffffffff9a98 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_3288,local_32b0,local_32d0,0x1f8,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_ffffffffffff9a98);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffff9a98);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffff9a98);
      std::allocator<char>::~allocator(&local_3289);
      bVar7 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar7);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
                 (unsigned_long)in_stack_ffffffffffff9a98);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffff9ad8,
                 (const_string *)in_stack_ffffffffffff9ad0,(size_t)in_stack_ffffffffffff9ac8,
                 (const_string *)in_stack_ffffffffffff9ac0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
                 (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
      ArgsManager::GetBoolArg
                ((ArgsManager *)in_stack_ffffffffffff9aa0,(string *)in_stack_ffffffffffff9a98,
                 SUB81((ulong)in_stack_ffffffffffff9aa8 >> 0x38,0));
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffff9aa8,
                 SUB81((ulong)in_stack_ffffffffffff9aa0 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
                 (unsigned_long)in_stack_ffffffffffff9a98);
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffff9aa0,
                 (basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
                 (unsigned_long)in_stack_ffffffffffff9a98);
      in_stack_ffffffffffff9a98 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_3308,local_3330,local_3350,0x1f9,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_ffffffffffff9a98);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffff9a98);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffff9a98);
      std::allocator<char>::~allocator(&local_3309);
      bVar7 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar7);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
                 (unsigned_long)in_stack_ffffffffffff9a98);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffff9ad8,
                 (const_string *)in_stack_ffffffffffff9ad0,(size_t)in_stack_ffffffffffff9ac8,
                 (const_string *)in_stack_ffffffffffff9ac0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
                 (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
      ArgsManager::GetBoolArg
                ((ArgsManager *)in_stack_ffffffffffff9aa0,(string *)in_stack_ffffffffffff9a98,
                 SUB81((ulong)in_stack_ffffffffffff9aa8 >> 0x38,0));
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffff9aa8,
                 SUB81((ulong)in_stack_ffffffffffff9aa0 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
                 (unsigned_long)in_stack_ffffffffffff9a98);
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffff9aa0,
                 (basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
                 (unsigned_long)in_stack_ffffffffffff9a98);
      in_stack_ffffffffffff9a98 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_3388,local_33b0,local_33d0,0x1fa,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_ffffffffffff9a98);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffff9a98);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffff9a98);
      std::allocator<char>::~allocator(&local_3389);
      bVar7 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar7);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
                 (unsigned_long)in_stack_ffffffffffff9a98);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffff9ad8,
                 (const_string *)in_stack_ffffffffffff9ad0,(size_t)in_stack_ffffffffffff9ac8,
                 (const_string *)in_stack_ffffffffffff9ac0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
                 (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
      ArgsManager::GetBoolArg
                ((ArgsManager *)in_stack_ffffffffffff9aa0,(string *)in_stack_ffffffffffff9a98,
                 SUB81((ulong)in_stack_ffffffffffff9aa8 >> 0x38,0));
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffff9aa8,
                 SUB81((ulong)in_stack_ffffffffffff9aa0 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
                 (unsigned_long)in_stack_ffffffffffff9a98);
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffff9aa0,
                 (basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
                 (unsigned_long)in_stack_ffffffffffff9a98);
      in_stack_ffffffffffff9a98 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_3408,local_3430,local_3450,0x1fb,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_ffffffffffff9a98);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffff9a98);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffff9a98);
      std::allocator<char>::~allocator(&local_3409);
      bVar7 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar7);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
                 (unsigned_long)in_stack_ffffffffffff9a98);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffff9ad8,
                 (const_string *)in_stack_ffffffffffff9ad0,(size_t)in_stack_ffffffffffff9ac8,
                 (const_string *)in_stack_ffffffffffff9ac0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
                 (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
      ArgsManager::GetBoolArg
                ((ArgsManager *)in_stack_ffffffffffff9aa0,(string *)in_stack_ffffffffffff9a98,
                 SUB81((ulong)in_stack_ffffffffffff9aa8 >> 0x38,0));
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffff9aa8,
                 SUB81((ulong)in_stack_ffffffffffff9aa0 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
                 (unsigned_long)in_stack_ffffffffffff9a98);
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffff9aa0,
                 (basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
                 (unsigned_long)in_stack_ffffffffffff9a98);
      in_stack_ffffffffffff9a98 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_3488,local_34b0,local_34d0,0x1fc,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_ffffffffffff9a98);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffff9a98);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffff9a98);
      std::allocator<char>::~allocator(&local_3489);
      bVar7 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar7);
  }
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffff9ad8,
               (const_string *)in_stack_ffffffffffff9ad0,(size_t)in_stack_ffffffffffff9ac8,
               (const_string *)in_stack_ffffffffffff9ac0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
               (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
    ArgsManager::GetArgs(in_stack_ffffffffffff9b10,in_stack_ffffffffffff9b08);
    sVar10 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_ffffffffffff9a98);
    if (sVar10 == 1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
                 (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
      ArgsManager::GetArgs(in_stack_ffffffffffff9b10,in_stack_ffffffffffff9b08);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::front((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_ffffffffffff9aa0);
      std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0);
    }
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffff9aa8,
               SUB81((ulong)in_stack_ffffffffffff9aa0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffff9aa0,
               (basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    in_stack_ffffffffffff9a98 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_3508,local_3568,local_3588,0x200,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffff9a98);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffff9a98);
    if (sVar10 == 1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_ffffffffffff9aa8);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffff9a98);
      std::allocator<char>::~allocator(local_3541);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_ffffffffffff9aa8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::allocator<char>::~allocator(local_3521);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffff9ad8,
               (const_string *)in_stack_ffffffffffff9ad0,(size_t)in_stack_ffffffffffff9ac8,
               (const_string *)in_stack_ffffffffffff9ac0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
               (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
    ArgsManager::GetArgs(in_stack_ffffffffffff9b10,in_stack_ffffffffffff9b08);
    sVar10 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_ffffffffffff9a98);
    if (sVar10 == 1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
                 (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
      ArgsManager::GetArgs(in_stack_ffffffffffff9b10,in_stack_ffffffffffff9b08);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::front((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_ffffffffffff9aa0);
      std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0);
    }
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffff9aa8,
               SUB81((ulong)in_stack_ffffffffffff9aa0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffff9aa0,
               (basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    in_stack_ffffffffffff9a98 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_35c0,local_3620,local_3640,0x202,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffff9a98);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffff9a98);
    if (sVar10 == 1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_ffffffffffff9aa8);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffff9a98);
      std::allocator<char>::~allocator(local_35f9);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_ffffffffffff9aa8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::allocator<char>::~allocator(local_35d9);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffff9ad8,
               (const_string *)in_stack_ffffffffffff9ad0,(size_t)in_stack_ffffffffffff9ac8,
               (const_string *)in_stack_ffffffffffff9ac0);
    std::allocator<char>::allocator();
    bVar6 = false;
    bVar5 = false;
    bVar4 = false;
    bVar3 = false;
    bVar2 = false;
    bVar7 = false;
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
               (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
    ArgsManager::GetArgs(in_stack_ffffffffffff9b10,in_stack_ffffffffffff9b08);
    sVar10 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_ffffffffffff9a98);
    if (sVar10 == 2) {
      std::allocator<char>::allocator();
      bVar6 = true;
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
                 (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
      bVar5 = true;
      ArgsManager::GetArgs(in_stack_ffffffffffff9b10,in_stack_ffffffffffff9b08);
      bVar4 = true;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::front((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_ffffffffffff9aa0);
      bVar8 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0);
      if (bVar8) {
        std::allocator<char>::allocator();
        bVar3 = true;
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
                   (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
        bVar2 = true;
        ArgsManager::GetArgs(in_stack_ffffffffffff9b10,in_stack_ffffffffffff9b08);
        bVar7 = true;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_ffffffffffff9a98);
        std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0);
      }
    }
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffff9aa8,
               SUB81((ulong)in_stack_ffffffffffff9aa0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffff9aa0,
               (basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    in_stack_ffffffffffff9a98 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_3678,local_36f8,local_3718,0x205,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffff9a98);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffff9a98);
    if (bVar7) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_ffffffffffff9aa8);
    }
    if (bVar2) {
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffff9a98);
    }
    if (bVar3) {
      std::allocator<char>::~allocator(local_36d1);
    }
    if (bVar4) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_ffffffffffff9aa8);
    }
    if (bVar5) {
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffff9a98);
    }
    if (bVar6) {
      std::allocator<char>::~allocator(local_36b1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_ffffffffffff9aa8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::allocator<char>::~allocator(local_3691);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffff9ad8,
               (const_string *)in_stack_ffffffffffff9ad0,(size_t)in_stack_ffffffffffff9ac8,
               (const_string *)in_stack_ffffffffffff9ac0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
               (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
    ArgsManager::GetArgs(in_stack_ffffffffffff9b10,in_stack_ffffffffffff9b08);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffff9a98);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffff9aa8,
               SUB81((ulong)in_stack_ffffffffffff9aa0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffff9aa0,
               (basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    in_stack_ffffffffffff9a98 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_3750,local_3790,local_37b0,0x206,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffff9a98);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffff9a98);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_ffffffffffff9aa8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::allocator<char>::~allocator(local_3769);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffff9ad8,
               (const_string *)in_stack_ffffffffffff9ad0,(size_t)in_stack_ffffffffffff9ac8,
               (const_string *)in_stack_ffffffffffff9ac0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
               (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
    ArgsManager::GetArgs(in_stack_ffffffffffff9b10,in_stack_ffffffffffff9b08);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffff9a98);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffff9aa8,
               SUB81((ulong)in_stack_ffffffffffff9aa0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffff9aa0,
               (basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    in_stack_ffffffffffff9a98 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_37e8,local_3828,local_3848,0x207,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffff9a98);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffff9a98);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_ffffffffffff9aa8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::allocator<char>::~allocator(local_3801);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffff9ad8,
               (const_string *)in_stack_ffffffffffff9ad0,(size_t)in_stack_ffffffffffff9ac8,
               (const_string *)in_stack_ffffffffffff9ac0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
               (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
    ArgsManager::GetArgs(in_stack_ffffffffffff9b10,in_stack_ffffffffffff9b08);
    sVar10 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_ffffffffffff9a98);
    if (sVar10 == 1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
                 (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
      ArgsManager::GetArgs(in_stack_ffffffffffff9b10,in_stack_ffffffffffff9b08);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::front((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_ffffffffffff9aa0);
      std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0);
    }
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffff9aa8,
               SUB81((ulong)in_stack_ffffffffffff9aa0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffff9aa0,
               (basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    in_stack_ffffffffffff9a98 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_3880,local_38e0,local_3900,0x209,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffff9a98);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffff9a98);
    if (sVar10 == 1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_ffffffffffff9aa8);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffff9a98);
      std::allocator<char>::~allocator(local_38b9);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_ffffffffffff9aa8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::allocator<char>::~allocator(local_3899);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffff9ad8,
               (const_string *)in_stack_ffffffffffff9ad0,(size_t)in_stack_ffffffffffff9ac8,
               (const_string *)in_stack_ffffffffffff9ac0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
               (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
    ArgsManager::GetArgs(in_stack_ffffffffffff9b10,in_stack_ffffffffffff9b08);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffff9a98);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffff9aa8,
               SUB81((ulong)in_stack_ffffffffffff9aa0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffff9aa0,
               (basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    in_stack_ffffffffffff9a98 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_3938,local_3978,local_3998,0x20a,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffff9a98);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffff9a98);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_ffffffffffff9aa8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::allocator<char>::~allocator(local_3951);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffff9ad8,
               (const_string *)in_stack_ffffffffffff9ad0,(size_t)in_stack_ffffffffffff9ac8,
               (const_string *)in_stack_ffffffffffff9ac0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
               (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
    ArgsManager::GetArgs(in_stack_ffffffffffff9b10,in_stack_ffffffffffff9b08);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffff9a98);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffff9aa8,
               SUB81((ulong)in_stack_ffffffffffff9aa0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffff9aa0,
               (basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    in_stack_ffffffffffff9a98 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_39d0,local_3a10,local_3a30,0x20b,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffff9a98);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffff9a98);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_ffffffffffff9aa8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::allocator<char>::~allocator(local_39e9);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffff9ad8,
               (const_string *)in_stack_ffffffffffff9ad0,(size_t)in_stack_ffffffffffff9ac8,
               (const_string *)in_stack_ffffffffffff9ac0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
               (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
    ArgsManager::GetArgs(in_stack_ffffffffffff9b10,in_stack_ffffffffffff9b08);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffff9a98);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffff9aa8,
               SUB81((ulong)in_stack_ffffffffffff9aa0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffff9aa0,
               (basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    in_stack_ffffffffffff9a98 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_3a68,local_3aa8,local_3ac8,0x20c,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffff9a98);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffff9a98);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_ffffffffffff9aa8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::allocator<char>::~allocator(local_3a81);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffff9ad8,
               (const_string *)in_stack_ffffffffffff9ad0,(size_t)in_stack_ffffffffffff9ac8,
               (const_string *)in_stack_ffffffffffff9ac0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
               (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
    ArgsManager::GetArgs(in_stack_ffffffffffff9b10,in_stack_ffffffffffff9b08);
    sVar10 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_ffffffffffff9a98);
    if (sVar10 == 1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
                 (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
      ArgsManager::GetArgs(in_stack_ffffffffffff9b10,in_stack_ffffffffffff9b08);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::front((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_ffffffffffff9aa0);
      std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0);
    }
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffff9aa8,
               SUB81((ulong)in_stack_ffffffffffff9aa0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffff9aa0,
               (basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    in_stack_ffffffffffff9a98 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_3b00,local_3b60,local_3b80,0x20e,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffff9a98);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffff9a98);
    if (sVar10 == 1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_ffffffffffff9aa8);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffff9a98);
      std::allocator<char>::~allocator(local_3b39);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_ffffffffffff9aa8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::allocator<char>::~allocator(local_3b19);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffff9ad8,
               (const_string *)in_stack_ffffffffffff9ad0,(size_t)in_stack_ffffffffffff9ac8,
               (const_string *)in_stack_ffffffffffff9ac0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
               (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
    ArgsManager::GetArgs(in_stack_ffffffffffff9b10,in_stack_ffffffffffff9b08);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffff9a98);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffff9aa8,
               SUB81((ulong)in_stack_ffffffffffff9aa0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffff9aa0,
               (basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    in_stack_ffffffffffff9a98 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_3bb8,local_3bf8,local_3c18,0x20f,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffff9a98);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffff9a98);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_ffffffffffff9aa8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::allocator<char>::~allocator(local_3bd1);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffff9ad8,
               (const_string *)in_stack_ffffffffffff9ad0,(size_t)in_stack_ffffffffffff9ac8,
               (const_string *)in_stack_ffffffffffff9ac0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
               (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
    ArgsManager::GetArgs(in_stack_ffffffffffff9b10,in_stack_ffffffffffff9b08);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffff9a98);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffff9aa8,
               SUB81((ulong)in_stack_ffffffffffff9aa0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffff9aa0,
               (basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    in_stack_ffffffffffff9a98 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_3c50,local_3c90,local_3cb0,0x210,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffff9a98);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffff9a98);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_ffffffffffff9aa8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::allocator<char>::~allocator(local_3c69);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffff9ad8,
               (const_string *)in_stack_ffffffffffff9ad0,(size_t)in_stack_ffffffffffff9ac8,
               (const_string *)in_stack_ffffffffffff9ac0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
               (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
    ArgsManager::IsArgNegated(in_stack_ffffffffffff9ac0,(string *)in_stack_ffffffffffff9ab8);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffff9aa8,
               SUB81((ulong)in_stack_ffffffffffff9aa0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffff9aa0,
               (basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    in_stack_ffffffffffff9a98 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_3ce8,local_3d10,local_3d30,0x212,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffff9a98);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffff9a98);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::allocator<char>::~allocator(&local_3ce9);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffff9ad8,
               (const_string *)in_stack_ffffffffffff9ad0,(size_t)in_stack_ffffffffffff9ac8,
               (const_string *)in_stack_ffffffffffff9ac0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
               (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
    ArgsManager::IsArgNegated(in_stack_ffffffffffff9ac0,(string *)in_stack_ffffffffffff9ab8);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffff9aa8,
               SUB81((ulong)in_stack_ffffffffffff9aa0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffff9aa0,
               (basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    in_stack_ffffffffffff9a98 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_3d68,local_3d90,local_3db0,0x213,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffff9a98);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffff9a98);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::allocator<char>::~allocator(&local_3d69);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffff9ad8,
               (const_string *)in_stack_ffffffffffff9ad0,(size_t)in_stack_ffffffffffff9ac8,
               (const_string *)in_stack_ffffffffffff9ac0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
               (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
    ArgsManager::IsArgNegated(in_stack_ffffffffffff9ac0,(string *)in_stack_ffffffffffff9ab8);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffff9aa8,
               SUB81((ulong)in_stack_ffffffffffff9aa0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffff9aa0,
               (basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    in_stack_ffffffffffff9a98 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_3de8,local_3e10,local_3e30,0x214,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffff9a98);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffff9a98);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::allocator<char>::~allocator(&local_3de9);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffff9ad8,
               (const_string *)in_stack_ffffffffffff9ad0,(size_t)in_stack_ffffffffffff9ac8,
               (const_string *)in_stack_ffffffffffff9ac0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
               (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
    ArgsManager::IsArgNegated(in_stack_ffffffffffff9ac0,(string *)in_stack_ffffffffffff9ab8);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffff9aa8,
               SUB81((ulong)in_stack_ffffffffffff9aa0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffff9aa0,
               (basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    in_stack_ffffffffffff9a98 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_3e68,local_3e90,local_3eb0,0x215,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffff9a98);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffff9a98);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::allocator<char>::~allocator(&local_3e69);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffff9ad8,
               (const_string *)in_stack_ffffffffffff9ad0,(size_t)in_stack_ffffffffffff9ac8,
               (const_string *)in_stack_ffffffffffff9ac0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
               (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
    ArgsManager::IsArgNegated(in_stack_ffffffffffff9ac0,(string *)in_stack_ffffffffffff9ab8);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffff9aa8,
               SUB81((ulong)in_stack_ffffffffffff9aa0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffff9aa0,
               (basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    in_stack_ffffffffffff9a98 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_3ee8,local_3f10,local_3f30,0x216,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffff9a98);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffff9a98);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::allocator<char>::~allocator(&local_3ee9);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffff9ad8,
               (const_string *)in_stack_ffffffffffff9ad0,(size_t)in_stack_ffffffffffff9ac8,
               (const_string *)in_stack_ffffffffffff9ac0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
               (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
    ArgsManager::IsArgNegated(in_stack_ffffffffffff9ac0,(string *)in_stack_ffffffffffff9ab8);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffff9aa8,
               SUB81((ulong)in_stack_ffffffffffff9aa0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffff9aa0,
               (basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    in_stack_ffffffffffff9a98 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_3f68,local_3f90,local_3fb0,0x217,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffff9a98);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffff9a98);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::allocator<char>::~allocator(&local_3f69);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffff9ad8,
               (const_string *)in_stack_ffffffffffff9ad0,(size_t)in_stack_ffffffffffff9ac8,
               (const_string *)in_stack_ffffffffffff9ac0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
               (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
    ArgsManager::IsArgNegated(in_stack_ffffffffffff9ac0,(string *)in_stack_ffffffffffff9ab8);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffff9aa8,
               SUB81((ulong)in_stack_ffffffffffff9aa0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffff9aa0,
               (basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    in_stack_ffffffffffff9a98 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_3fe8,&local_4010,local_4030,0x218,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffff9a98);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffff9a98);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::allocator<char>::~allocator(&local_3fe9);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffff9ad8,
               (const_string *)in_stack_ffffffffffff9ad0,(size_t)in_stack_ffffffffffff9ac8,
               (const_string *)in_stack_ffffffffffff9ac0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
               (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
    ArgsManager::IsArgNegated(in_stack_ffffffffffff9ac0,(string *)in_stack_ffffffffffff9ab8);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffff9aa8,
               SUB81((ulong)in_stack_ffffffffffff9aa0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffff9aa0,
               (basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    in_stack_ffffffffffff9a98 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_4068,local_4090,local_40b0,0x219,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffff9a98);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffff9a98);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::allocator<char>::~allocator(&local_4069);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffff9ad8,
               (const_string *)in_stack_ffffffffffff9ad0,(size_t)in_stack_ffffffffffff9ac8,
               (const_string *)in_stack_ffffffffffff9ac0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
               (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
    ArgsManager::IsArgNegated(in_stack_ffffffffffff9ac0,(string *)in_stack_ffffffffffff9ab8);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffff9aa8,
               SUB81((ulong)in_stack_ffffffffffff9aa0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffff9aa0,
               (basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    in_stack_ffffffffffff9a98 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_40e8,local_4110,local_4130,0x21a,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffff9a98);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffff9a98);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::allocator<char>::~allocator(&local_40e9);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
             (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
  ArgsManager::SelectConfigNetwork(in_stack_ffffffffffff9ab8,in_stack_ffffffffffff9ab0);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffff9a98);
  std::allocator<char>::~allocator(&local_4131);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffff9ad8,
               (const_string *)in_stack_ffffffffffff9ad0,(size_t)in_stack_ffffffffffff9ac8,
               (const_string *)in_stack_ffffffffffff9ac0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffff9aa0,(char (*) [1])in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
               (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
               (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
    ArgsManager::GetArg(in_stack_ffffffffffff9ad8,&in_stack_ffffffffffff9ad0->first,
                        in_stack_ffffffffffff9ac8);
    in_stack_ffffffffffff9aa8 = "\"\"";
    in_stack_ffffffffffff9aa0 = "";
    in_stack_ffffffffffff9a98 = "test_args.GetArg(\"-a\", \"xxx\")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[1]>
              (local_4178,local_4188,0x220,1,2,local_1140);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::allocator<char>::~allocator(&local_418a);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::allocator<char>::~allocator(&local_4189);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffff9a98);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffff9ad8,
               (const_string *)in_stack_ffffffffffff9ad0,(size_t)in_stack_ffffffffffff9ac8,
               (const_string *)in_stack_ffffffffffff9ac0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffff9aa0,(char (*) [1])in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
               (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
               (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
    ArgsManager::GetArg(in_stack_ffffffffffff9ad8,&in_stack_ffffffffffff9ad0->first,
                        in_stack_ffffffffffff9ac8);
    in_stack_ffffffffffff9aa8 = "\"1\"";
    in_stack_ffffffffffff9aa0 = "1";
    in_stack_ffffffffffff9a98 = "test_args.GetArg(\"-b\", \"xxx\")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[2]>
              (local_41d0,local_41e0,0x221,1,2,local_11a0);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::allocator<char>::~allocator(&local_41e2);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::allocator<char>::~allocator(&local_41e1);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffff9a98);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffff9ad8,
               (const_string *)in_stack_ffffffffffff9ad0,(size_t)in_stack_ffffffffffff9ac8,
               (const_string *)in_stack_ffffffffffff9ac0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffff9aa0,(char (*) [1])in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
               (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
               (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
    ArgsManager::GetArg(in_stack_ffffffffffff9ad8,&in_stack_ffffffffffff9ad0->first,
                        in_stack_ffffffffffff9ac8);
    in_stack_ffffffffffff9aa8 = "\"0\"";
    in_stack_ffffffffffff9aa0 = "0";
    in_stack_ffffffffffff9a98 = "test_args.GetArg(\"-fff\", \"xxx\")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[2]>
              (local_4228,local_4238,0x222,1,2,local_1200);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::allocator<char>::~allocator(&local_423a);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::allocator<char>::~allocator(&local_4239);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffff9a98);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffff9ad8,
               (const_string *)in_stack_ffffffffffff9ad0,(size_t)in_stack_ffffffffffff9ac8,
               (const_string *)in_stack_ffffffffffff9ac0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffff9aa0,(char (*) [1])in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
               (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
               (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
    ArgsManager::GetArg(in_stack_ffffffffffff9ad8,&in_stack_ffffffffffff9ad0->first,
                        in_stack_ffffffffffff9ac8);
    in_stack_ffffffffffff9aa8 = "\"1\"";
    in_stack_ffffffffffff9aa0 = "1";
    in_stack_ffffffffffff9a98 = "test_args.GetArg(\"-ggg\", \"xxx\")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[2]>
              (local_4280,local_4290,0x223,1,2,local_1260);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::allocator<char>::~allocator(&local_4292);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::allocator<char>::~allocator(&local_4291);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffff9a98);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffff9ad8,
               (const_string *)in_stack_ffffffffffff9ad0,(size_t)in_stack_ffffffffffff9ac8,
               (const_string *)in_stack_ffffffffffff9ac0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffff9aa0,(char (*) [1])in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
               (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
               (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
    ArgsManager::GetArg(in_stack_ffffffffffff9ad8,&in_stack_ffffffffffff9ad0->first,
                        in_stack_ffffffffffff9ac8);
    in_stack_ffffffffffff9aa8 = "\"xxx\"";
    in_stack_ffffffffffff9aa0 = "xxx";
    in_stack_ffffffffffff9a98 = "test_args.GetArg(\"-zzz\", \"xxx\")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[4]>
              (local_42d8,local_42e8,0x224,1,2,local_12c0);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::allocator<char>::~allocator(&local_42ea);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::allocator<char>::~allocator(&local_42e9);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffff9a98);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffff9ad8,
               (const_string *)in_stack_ffffffffffff9ad0,(size_t)in_stack_ffffffffffff9ac8,
               (const_string *)in_stack_ffffffffffff9ac0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffff9aa0,(char (*) [1])in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
               (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
               (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
    ArgsManager::GetArg(in_stack_ffffffffffff9ad8,&in_stack_ffffffffffff9ad0->first,
                        in_stack_ffffffffffff9ac8);
    in_stack_ffffffffffff9aa8 = "\"xxx\"";
    in_stack_ffffffffffff9aa0 = "xxx";
    in_stack_ffffffffffff9a98 = "test_args.GetArg(\"-iii\", \"xxx\")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[4]>
              (local_4330,local_4340,0x225,1,2,local_1320);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::allocator<char>::~allocator(&local_4342);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::allocator<char>::~allocator(&local_4341);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffff9a98);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffff9ad8,
               (const_string *)in_stack_ffffffffffff9ad0,(size_t)in_stack_ffffffffffff9ac8,
               (const_string *)in_stack_ffffffffffff9ac0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
               (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
               (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
    ArgsManager::GetArg(in_stack_ffffffffffff9ad8,&in_stack_ffffffffffff9ad0->first,
                        in_stack_ffffffffffff9ac8);
    std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffff9aa8,
               SUB81((ulong)in_stack_ffffffffffff9aa0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffff9aa0,
               (basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    in_stack_ffffffffffff9a98 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_4380,local_43a8,local_43c8,0x227,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffff9a98);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffff9a98);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::allocator<char>::~allocator(&local_4382);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::allocator<char>::~allocator(&local_4381);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffff9ad8,
               (const_string *)in_stack_ffffffffffff9ad0,(size_t)in_stack_ffffffffffff9ac8,
               (const_string *)in_stack_ffffffffffff9ac0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
               (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
               (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
    ArgsManager::GetArg(in_stack_ffffffffffff9ad8,&in_stack_ffffffffffff9ad0->first,
                        in_stack_ffffffffffff9ac8);
    std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffff9aa8,
               SUB81((ulong)in_stack_ffffffffffff9aa0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffff9aa0,
               (basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    in_stack_ffffffffffff9a98 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_4400,local_4428,local_4448,0x229,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffff9a98);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffff9a98);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::allocator<char>::~allocator(&local_4402);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::allocator<char>::~allocator(&local_4401);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffff9ad8,
               (const_string *)in_stack_ffffffffffff9ad0,(size_t)in_stack_ffffffffffff9ac8,
               (const_string *)in_stack_ffffffffffff9ac0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
               (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
               (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
    ArgsManager::GetArg(in_stack_ffffffffffff9ad8,&in_stack_ffffffffffff9ad0->first,
                        in_stack_ffffffffffff9ac8);
    std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffff9aa8,
               SUB81((ulong)in_stack_ffffffffffff9aa0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffff9aa0,
               (basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    in_stack_ffffffffffff9a98 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_4480,local_44a8,local_44c8,0x22b,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffff9a98);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffff9a98);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::allocator<char>::~allocator(&local_4482);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::allocator<char>::~allocator(&local_4481);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
             (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
             (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
             (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
             (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)in_stack_ffffffffffff9a98);
  __l_00._M_len._0_4_ = in_stack_ffffffffffff9ae8;
  __l_00._M_array = in_stack_ffffffffffff9ae0;
  __l_00._M_len._4_4_ = in_stack_ffffffffffff9aec;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffff9ad8,__l_00,(allocator_type *)in_stack_ffffffffffff9ad0);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)in_stack_ffffffffffff9a98);
  local_6090 = local_1480;
  do {
    local_6090 = local_6090 + -0x20;
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
  } while (local_6090 != local_1500);
  std::allocator<char>::~allocator(&local_44e4);
  std::allocator<char>::~allocator(&local_44e3);
  std::allocator<char>::~allocator(&local_44e2);
  std::allocator<char>::~allocator(&local_44e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
             (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
  ArgsManager::GetArgs(in_stack_ffffffffffff9b10,in_stack_ffffffffffff9b08);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffff9a98);
  std::allocator<char>::~allocator(local_4501);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffff9ad8,
               (const_string *)in_stack_ffffffffffff9ad0,(size_t)in_stack_ffffffffffff9ac8,
               (const_string *)in_stack_ffffffffffff9ac0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_ffffffffffff9aa0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)in_stack_ffffffffffff9aa0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_ffffffffffff9aa0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)in_stack_ffffffffffff9aa0);
    left_end._M_current._7_1_ = in_stack_ffffffffffff9ba7;
    left_end._M_current._0_7_ = in_stack_ffffffffffff9ba0;
    right_end._M_current._7_1_ = in_stack_ffffffffffff9b97;
    right_end._M_current._0_7_ = in_stack_ffffffffffff9b90;
    boost::test_tools::tt_detail::equal_coll_impl::operator()
              (in_stack_ffffffffffff9b58,in_stack_ffffffffffff9ba8,left_end,
               in_stack_ffffffffffff9b98,right_end);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffff9aa0,(char (*) [1])in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    pcVar13 = "sec1_ccc_expected.end()";
    pcVar12 = "sec1_ccc_expected.begin()";
    in_stack_ffffffffffff9aa8 = "sec1_ccc_res.end()";
    in_stack_ffffffffffff9aa0 = "sec1_ccc_res.begin()";
    in_stack_ffffffffffff9a98 = &DAT_00000004;
    boost::test_tools::tt_detail::report_assertion
              (local_4540,local_4568,&local_4578,0x22f,CHECK,CHECK_EQUAL_COLL);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffff9a98);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffff9a98);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
             (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
  ArgsManager::SelectConfigNetwork((ArgsManager *)pcVar13,(string *)pcVar12);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffff9a98);
  std::allocator<char>::~allocator(&local_4579);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffff9ad8,
               (const_string *)in_stack_ffffffffffff9ad0,(size_t)in_stack_ffffffffffff9ac8,
               (const_string *)in_stack_ffffffffffff9ac0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
               (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
               (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
    ArgsManager::GetArg(in_stack_ffffffffffff9ad8,&in_stack_ffffffffffff9ad0->first,
                        in_stack_ffffffffffff9ac8);
    std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffff9aa8,
               SUB81((ulong)in_stack_ffffffffffff9aa0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffff9aa0,
               (basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    in_stack_ffffffffffff9a98 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_45b8,local_45e0,local_4600,0x234,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffff9a98);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffff9a98);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::allocator<char>::~allocator(&local_45ba);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::allocator<char>::~allocator(&local_45b9);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffff9ad8,
               (const_string *)in_stack_ffffffffffff9ad0,(size_t)in_stack_ffffffffffff9ac8,
               (const_string *)in_stack_ffffffffffff9ac0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
               (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
               (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
    ArgsManager::GetArg(in_stack_ffffffffffff9ad8,&in_stack_ffffffffffff9ad0->first,
                        in_stack_ffffffffffff9ac8);
    std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffff9aa8,
               SUB81((ulong)in_stack_ffffffffffff9aa0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffff9aa0,
               (basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    in_stack_ffffffffffff9a98 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_4638,local_4660,local_4680,0x235,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffff9a98);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffff9a98);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::allocator<char>::~allocator(&local_463a);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::allocator<char>::~allocator(&local_4639);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffff9ad8,
               (const_string *)in_stack_ffffffffffff9ad0,(size_t)in_stack_ffffffffffff9ac8,
               (const_string *)in_stack_ffffffffffff9ac0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
               (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
               (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
    ArgsManager::GetArg(in_stack_ffffffffffff9ad8,&in_stack_ffffffffffff9ad0->first,
                        in_stack_ffffffffffff9ac8);
    std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffff9aa8,
               SUB81((ulong)in_stack_ffffffffffff9aa0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffff9aa0,
               (basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    in_stack_ffffffffffff9a98 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_46b8,local_46e0,local_4700,0x236,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffff9a98);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffff9a98);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::allocator<char>::~allocator(&local_46ba);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::allocator<char>::~allocator(&local_46b9);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffff9ad8,
               (const_string *)in_stack_ffffffffffff9ad0,(size_t)in_stack_ffffffffffff9ac8,
               (const_string *)in_stack_ffffffffffff9ac0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
               (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
               (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
    ArgsManager::GetArg(in_stack_ffffffffffff9ad8,&in_stack_ffffffffffff9ad0->first,
                        in_stack_ffffffffffff9ac8);
    std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffff9aa8,
               SUB81((ulong)in_stack_ffffffffffff9aa0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffff9aa0,
               (basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    in_stack_ffffffffffff9a98 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_4738,local_4760,local_4780,0x237,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffff9a98);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffff9a98);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::allocator<char>::~allocator(&local_473a);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::allocator<char>::~allocator(&local_4739);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffff9ad8,
               (const_string *)in_stack_ffffffffffff9ad0,(size_t)in_stack_ffffffffffff9ac8,
               (const_string *)in_stack_ffffffffffff9ac0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
               (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
               (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
    ArgsManager::GetArg(in_stack_ffffffffffff9ad8,&in_stack_ffffffffffff9ad0->first,
                        in_stack_ffffffffffff9ac8);
    std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffff9aa8,
               SUB81((ulong)in_stack_ffffffffffff9aa0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffff9aa0,
               (basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    in_stack_ffffffffffff9a98 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_47b8,local_47e0,local_4800,0x238,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffff9a98);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffff9a98);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::allocator<char>::~allocator(&local_47ba);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::allocator<char>::~allocator(&local_47b9);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffff9ad8,
               (const_string *)in_stack_ffffffffffff9ad0,(size_t)in_stack_ffffffffffff9ac8,
               (const_string *)in_stack_ffffffffffff9ac0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
               (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
               (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
    ArgsManager::GetArg(in_stack_ffffffffffff9ad8,&in_stack_ffffffffffff9ad0->first,
                        in_stack_ffffffffffff9ac8);
    std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffff9aa8,
               SUB81((ulong)in_stack_ffffffffffff9aa0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffff9aa0,
               (basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    in_stack_ffffffffffff9a98 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_4838,local_4860,local_4880,0x239,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffff9a98);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffff9a98);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::allocator<char>::~allocator(&local_483a);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::allocator<char>::~allocator(&local_4839);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffff9ad8,
               (const_string *)in_stack_ffffffffffff9ad0,(size_t)in_stack_ffffffffffff9ac8,
               (const_string *)in_stack_ffffffffffff9ac0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
               (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
               (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
    ArgsManager::GetArg(in_stack_ffffffffffff9ad8,&in_stack_ffffffffffff9ad0->first,
                        in_stack_ffffffffffff9ac8);
    std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffff9aa8,
               SUB81((ulong)in_stack_ffffffffffff9aa0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffff9aa0,
               (basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    in_stack_ffffffffffff9a98 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_48b8,local_48e0,local_4900,0x23a,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffff9a98);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffff9a98);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::allocator<char>::~allocator(&local_48ba);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::allocator<char>::~allocator(&local_48b9);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffff9ad8,
               (const_string *)in_stack_ffffffffffff9ad0,(size_t)in_stack_ffffffffffff9ac8,
               (const_string *)in_stack_ffffffffffff9ac0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
               (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
               (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
    ArgsManager::GetArg(in_stack_ffffffffffff9ad8,&in_stack_ffffffffffff9ad0->first,
                        in_stack_ffffffffffff9ac8);
    std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffff9aa8,
               SUB81((ulong)in_stack_ffffffffffff9aa0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffff9aa0,
               (basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    in_stack_ffffffffffff9a98 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_4938,local_4960,local_4980,0x23c,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffff9a98);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffff9a98);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::allocator<char>::~allocator(&local_493a);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::allocator<char>::~allocator(&local_4939);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffff9ad8,
               (const_string *)in_stack_ffffffffffff9ad0,(size_t)in_stack_ffffffffffff9ac8,
               (const_string *)in_stack_ffffffffffff9ac0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
               (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
               (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
    ArgsManager::GetArg(in_stack_ffffffffffff9ad8,&in_stack_ffffffffffff9ad0->first,
                        in_stack_ffffffffffff9ac8);
    std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffff9aa8,
               SUB81((ulong)in_stack_ffffffffffff9aa0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffff9aa0,
               (basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    in_stack_ffffffffffff9a98 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_49b8,local_49e0,local_4a00,0x23e,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffff9a98);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffff9a98);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::allocator<char>::~allocator(&local_49ba);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::allocator<char>::~allocator(&local_49b9);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
             (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
             (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
             (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)in_stack_ffffffffffff9a98);
  __l_01._M_len._0_4_ = in_stack_ffffffffffff9ae8;
  __l_01._M_array = in_stack_ffffffffffff9ae0;
  __l_01._M_len._4_4_ = in_stack_ffffffffffff9aec;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffff9ad8,__l_01,(allocator_type *)in_stack_ffffffffffff9ad0);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)in_stack_ffffffffffff9a98);
  local_62c0 = local_18a0;
  do {
    local_62c0 = local_62c0 + -0x20;
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
  } while (local_62c0 != local_1900);
  std::allocator<char>::~allocator(&local_4a1b);
  std::allocator<char>::~allocator(&local_4a1a);
  std::allocator<char>::~allocator(&local_4a19);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
             (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
  ArgsManager::GetArgs(in_stack_ffffffffffff9b10,in_stack_ffffffffffff9b08);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffff9a98);
  std::allocator<char>::~allocator(local_4a39);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffff9ad8,
               (const_string *)in_stack_ffffffffffff9ad0,(size_t)in_stack_ffffffffffff9ac8,
               (const_string *)in_stack_ffffffffffff9ac0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_ffffffffffff9aa0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)in_stack_ffffffffffff9aa0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_ffffffffffff9aa0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)in_stack_ffffffffffff9aa0);
    left_end_00._M_current._7_1_ = in_stack_ffffffffffff9ba7;
    left_end_00._M_current._0_7_ = in_stack_ffffffffffff9ba0;
    right_end_00._M_current._7_1_ = in_stack_ffffffffffff9b97;
    right_end_00._M_current._0_7_ = in_stack_ffffffffffff9b90;
    boost::test_tools::tt_detail::equal_coll_impl::operator()
              (in_stack_ffffffffffff9b58,in_stack_ffffffffffff9ba8,left_end_00,
               in_stack_ffffffffffff9b98,right_end_00);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffff9aa0,(char (*) [1])in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    pcVar13 = "sec2_ccc_expected.end()";
    pcVar12 = "sec2_ccc_expected.begin()";
    in_stack_ffffffffffff9aa8 = "sec2_ccc_res.end()";
    in_stack_ffffffffffff9aa0 = "sec2_ccc_res.begin()";
    in_stack_ffffffffffff9a98 = &DAT_00000004;
    boost::test_tools::tt_detail::report_assertion
              (local_4a78,local_4aa0,&local_4ab0,0x242,CHECK,CHECK_EQUAL_COLL);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffff9a98);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffff9a98);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
             (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
  TestArgsManager::SetNetworkOnlyArg
            ((TestArgsManager *)in_stack_ffffffffffff9ad8,&in_stack_ffffffffffff9ad0->first);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffff9a98);
  std::allocator<char>::~allocator(&local_4ab1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
             (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
  TestArgsManager::SetNetworkOnlyArg
            ((TestArgsManager *)in_stack_ffffffffffff9ad8,&in_stack_ffffffffffff9ad0->first);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffff9a98);
  std::allocator<char>::~allocator(&local_4ab2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
             (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
  TestArgsManager::SetNetworkOnlyArg
            ((TestArgsManager *)in_stack_ffffffffffff9ad8,&in_stack_ffffffffffff9ad0->first);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffff9a98);
  std::allocator<char>::~allocator(&local_4ab3);
  ChainTypeToString_abi_cxx11_(in_stack_ffffffffffff9aec);
  ArgsManager::SelectConfigNetwork((ArgsManager *)pcVar13,(string *)pcVar12);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffff9a98);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffff9ad8,
               (const_string *)in_stack_ffffffffffff9ad0,(size_t)in_stack_ffffffffffff9ac8,
               (const_string *)in_stack_ffffffffffff9ac0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
               (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
               (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
    ArgsManager::GetArg(in_stack_ffffffffffff9ad8,&in_stack_ffffffffffff9ad0->first,
                        in_stack_ffffffffffff9ac8);
    std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffff9aa8,
               SUB81((ulong)in_stack_ffffffffffff9aa0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffff9aa0,
               (basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    in_stack_ffffffffffff9a98 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_4af0,local_4b18,local_4b38,0x24b,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffff9a98);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffff9a98);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::allocator<char>::~allocator(&local_4af2);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::allocator<char>::~allocator(&local_4af1);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffff9ad8,
               (const_string *)in_stack_ffffffffffff9ad0,(size_t)in_stack_ffffffffffff9ac8,
               (const_string *)in_stack_ffffffffffff9ac0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
               (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
    ArgsManager::GetArgs(in_stack_ffffffffffff9b10,in_stack_ffffffffffff9b08);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffff9a98);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffff9aa8,
               SUB81((ulong)in_stack_ffffffffffff9aa0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffff9aa0,
               (basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    in_stack_ffffffffffff9a98 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_4b70,local_4bb0,local_4bd0,0x24c,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffff9a98);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffff9a98);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_ffffffffffff9aa8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::allocator<char>::~allocator(local_4b89);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffff9ad8,
               (const_string *)in_stack_ffffffffffff9ad0,(size_t)in_stack_ffffffffffff9ac8,
               (const_string *)in_stack_ffffffffffff9ac0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
               (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
               (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
    ArgsManager::GetArg(in_stack_ffffffffffff9ad8,&in_stack_ffffffffffff9ad0->first,
                        in_stack_ffffffffffff9ac8);
    std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffff9aa8,
               SUB81((ulong)in_stack_ffffffffffff9aa0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffff9aa0,
               (basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    in_stack_ffffffffffff9a98 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_4c08,local_4c30,local_4c50,0x24d,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffff9a98);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffff9a98);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::allocator<char>::~allocator(&local_4c0a);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::allocator<char>::~allocator(&local_4c09);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
             (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
  ArgsManager::SelectConfigNetwork((ArgsManager *)pcVar13,(string *)pcVar12);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffff9a98);
  std::allocator<char>::~allocator(&local_4c51);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffff9ad8,
               (const_string *)in_stack_ffffffffffff9ad0,(size_t)in_stack_ffffffffffff9ac8,
               (const_string *)in_stack_ffffffffffff9ac0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
               (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
               (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
    ArgsManager::GetArg(in_stack_ffffffffffff9ad8,&in_stack_ffffffffffff9ad0->first,
                        in_stack_ffffffffffff9ac8);
    std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffff9aa8,
               SUB81((ulong)in_stack_ffffffffffff9aa0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffff9aa0,
               (basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    in_stack_ffffffffffff9a98 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_4c90,local_4cb8,local_4cd8,0x250,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffff9a98);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffff9a98);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::allocator<char>::~allocator(&local_4c92);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::allocator<char>::~allocator(&local_4c91);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffff9ad8,
               (const_string *)in_stack_ffffffffffff9ad0,(size_t)in_stack_ffffffffffff9ac8,
               (const_string *)in_stack_ffffffffffff9ac0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
               (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
    ArgsManager::GetArgs(in_stack_ffffffffffff9b10,in_stack_ffffffffffff9b08);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffff9a98);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffff9aa8,
               SUB81((ulong)in_stack_ffffffffffff9aa0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffff9aa0,
               (basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    in_stack_ffffffffffff9a98 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_4d10,local_4d50,local_4d70,0x251,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffff9a98);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffff9a98);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_ffffffffffff9aa8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::allocator<char>::~allocator(local_4d29);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffff9ad8,
               (const_string *)in_stack_ffffffffffff9ad0,(size_t)in_stack_ffffffffffff9ac8,
               (const_string *)in_stack_ffffffffffff9ac0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
               (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
    ArgsManager::GetArgs(in_stack_ffffffffffff9b10,in_stack_ffffffffffff9b08);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffff9a98);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffff9aa8,
               SUB81((ulong)in_stack_ffffffffffff9aa0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffff9aa0,
               (basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    in_stack_ffffffffffff9a98 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_4da8,local_4de8,local_4e08,0x252,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffff9a98);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffff9a98);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_ffffffffffff9aa8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::allocator<char>::~allocator(local_4dc1);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffff9ad8,
               (const_string *)in_stack_ffffffffffff9ad0,(size_t)in_stack_ffffffffffff9ac8,
               (const_string *)in_stack_ffffffffffff9ac0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
               (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
               (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
    ArgsManager::GetArg(in_stack_ffffffffffff9ad8,&in_stack_ffffffffffff9ad0->first,
                        in_stack_ffffffffffff9ac8);
    std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffff9aa8,
               SUB81((ulong)in_stack_ffffffffffff9aa0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffff9aa0,
               (basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    in_stack_ffffffffffff9a98 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_4e40,local_4e68,local_4e88,0x253,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffff9a98);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffff9a98);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::allocator<char>::~allocator(&local_4e42);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::allocator<char>::~allocator(&local_4e41);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
             (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
  ArgsManager::SelectConfigNetwork((ArgsManager *)pcVar13,(string *)pcVar12);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffff9a98);
  std::allocator<char>::~allocator(&local_4e89);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffff9ad8,
               (const_string *)in_stack_ffffffffffff9ad0,(size_t)in_stack_ffffffffffff9ac8,
               (const_string *)in_stack_ffffffffffff9ac0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
               (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
               (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
    ArgsManager::GetArg(in_stack_ffffffffffff9ad8,&in_stack_ffffffffffff9ad0->first,
                        in_stack_ffffffffffff9ac8);
    std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffff9aa8,
               SUB81((ulong)in_stack_ffffffffffff9aa0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffff9aa0,
               (basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    in_stack_ffffffffffff9a98 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_4ec8,local_4ef0,local_4f10,0x256,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffff9a98);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffff9a98);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::allocator<char>::~allocator(&local_4eca);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::allocator<char>::~allocator(&local_4ec9);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffff9ad8,
               (const_string *)in_stack_ffffffffffff9ad0,(size_t)in_stack_ffffffffffff9ac8,
               (const_string *)in_stack_ffffffffffff9ac0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
               (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
    ArgsManager::GetArgs(in_stack_ffffffffffff9b10,in_stack_ffffffffffff9b08);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffff9a98);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffff9aa8,
               SUB81((ulong)in_stack_ffffffffffff9aa0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffff9aa0,
               (basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    in_stack_ffffffffffff9a98 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_4f48,local_4f88,local_4fa8,599,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffff9a98);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffff9a98);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_ffffffffffff9aa8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::allocator<char>::~allocator(local_4f61);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffff9ad8,
               (const_string *)in_stack_ffffffffffff9ad0,(size_t)in_stack_ffffffffffff9ac8,
               (const_string *)in_stack_ffffffffffff9ac0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
               (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
    ArgsManager::GetArgs(in_stack_ffffffffffff9b10,in_stack_ffffffffffff9b08);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffff9a98);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffff9aa8,
               SUB81((ulong)in_stack_ffffffffffff9aa0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffff9aa0,
               (basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    in_stack_ffffffffffff9a98 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_4fe0,local_5020,local_5040,600,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffff9a98);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffff9a98);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_ffffffffffff9aa8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::allocator<char>::~allocator((allocator<char> *)((long)&local_5000 + 7));
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffff9ad8,
               (const_string *)in_stack_ffffffffffff9ad0,(size_t)in_stack_ffffffffffff9ac8,
               (const_string *)in_stack_ffffffffffff9ac0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
               (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffff9aec,in_stack_ffffffffffff9ae8),
               (char *)in_stack_ffffffffffff9ae0,(allocator<char> *)in_stack_ffffffffffff9ad8);
    ArgsManager::GetArg(in_stack_ffffffffffff9ad8,&in_stack_ffffffffffff9ad0->first,
                        in_stack_ffffffffffff9ac8);
    std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffff9aa8,
               SUB81((ulong)in_stack_ffffffffffff9aa0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffff9aa0,
               (basic_cstring<const_char> *)in_stack_ffffffffffff9a98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffff9aa8,in_stack_ffffffffffff9aa0,
               (unsigned_long)in_stack_ffffffffffff9a98);
    in_stack_ffffffffffff9a98 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_5078,local_50a0,local_50c0,0x259,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffff9a98);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffff9a98);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::allocator<char>::~allocator(&local_507a);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff9a98);
    std::allocator<char>::~allocator(&local_5079);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_ffffffffffff9aa8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_ffffffffffff9aa8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_ffffffffffff9aa8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_ffffffffffff9aa8);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffff9a98);
  TestArgsManager::~TestArgsManager((TestArgsManager *)in_stack_ffffffffffff9a98);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(util_ReadConfigStream)
{
    const char *str_config =
       "a=\n"
       "b=1\n"
       "ccc=argument\n"
       "ccc=multiple\n"
       "d=e\n"
       "nofff=1\n"
       "noggg=0\n"
       "h=1\n"
       "noh=1\n"
       "noi=1\n"
       "i=1\n"
       "sec1.ccc=extend1\n"
       "\n"
       "[sec1]\n"
       "ccc=extend2\n"
       "d=eee\n"
       "h=1\n"
       "[sec2]\n"
       "ccc=extend3\n"
       "iii=2\n";

    TestArgsManager test_args;
    LOCK(test_args.cs_args);
    const auto a = std::make_pair("-a", ArgsManager::ALLOW_ANY);
    const auto b = std::make_pair("-b", ArgsManager::ALLOW_ANY);
    const auto ccc = std::make_pair("-ccc", ArgsManager::ALLOW_ANY);
    const auto d = std::make_pair("-d", ArgsManager::ALLOW_ANY);
    const auto e = std::make_pair("-e", ArgsManager::ALLOW_ANY);
    const auto fff = std::make_pair("-fff", ArgsManager::ALLOW_ANY);
    const auto ggg = std::make_pair("-ggg", ArgsManager::ALLOW_ANY);
    const auto h = std::make_pair("-h", ArgsManager::ALLOW_ANY);
    const auto i = std::make_pair("-i", ArgsManager::ALLOW_ANY);
    const auto iii = std::make_pair("-iii", ArgsManager::ALLOW_ANY);
    test_args.SetupArgs({a, b, ccc, d, e, fff, ggg, h, i, iii});

    test_args.ReadConfigString(str_config);
    // expectation: a, b, ccc, d, fff, ggg, h, i end up in map
    // so do sec1.ccc, sec1.d, sec1.h, sec2.ccc, sec2.iii

    BOOST_CHECK(test_args.m_settings.command_line_options.empty());
    BOOST_CHECK(test_args.m_settings.ro_config.size() == 3);
    BOOST_CHECK(test_args.m_settings.ro_config[""].size() == 8);
    BOOST_CHECK(test_args.m_settings.ro_config["sec1"].size() == 3);
    BOOST_CHECK(test_args.m_settings.ro_config["sec2"].size() == 2);

    BOOST_CHECK(test_args.m_settings.ro_config[""].count("a"));
    BOOST_CHECK(test_args.m_settings.ro_config[""].count("b"));
    BOOST_CHECK(test_args.m_settings.ro_config[""].count("ccc"));
    BOOST_CHECK(test_args.m_settings.ro_config[""].count("d"));
    BOOST_CHECK(test_args.m_settings.ro_config[""].count("fff"));
    BOOST_CHECK(test_args.m_settings.ro_config[""].count("ggg"));
    BOOST_CHECK(test_args.m_settings.ro_config[""].count("h"));
    BOOST_CHECK(test_args.m_settings.ro_config[""].count("i"));
    BOOST_CHECK(test_args.m_settings.ro_config["sec1"].count("ccc"));
    BOOST_CHECK(test_args.m_settings.ro_config["sec1"].count("h"));
    BOOST_CHECK(test_args.m_settings.ro_config["sec2"].count("ccc"));
    BOOST_CHECK(test_args.m_settings.ro_config["sec2"].count("iii"));

    BOOST_CHECK(test_args.IsArgSet("-a"));
    BOOST_CHECK(test_args.IsArgSet("-b"));
    BOOST_CHECK(test_args.IsArgSet("-ccc"));
    BOOST_CHECK(test_args.IsArgSet("-d"));
    BOOST_CHECK(test_args.IsArgSet("-fff"));
    BOOST_CHECK(test_args.IsArgSet("-ggg"));
    BOOST_CHECK(test_args.IsArgSet("-h"));
    BOOST_CHECK(test_args.IsArgSet("-i"));
    BOOST_CHECK(!test_args.IsArgSet("-zzz"));
    BOOST_CHECK(!test_args.IsArgSet("-iii"));

    BOOST_CHECK_EQUAL(test_args.GetArg("-a", "xxx"), "");
    BOOST_CHECK_EQUAL(test_args.GetArg("-b", "xxx"), "1");
    BOOST_CHECK_EQUAL(test_args.GetArg("-ccc", "xxx"), "argument");
    BOOST_CHECK_EQUAL(test_args.GetArg("-d", "xxx"), "e");
    BOOST_CHECK_EQUAL(test_args.GetArg("-fff", "xxx"), "0");
    BOOST_CHECK_EQUAL(test_args.GetArg("-ggg", "xxx"), "1");
    BOOST_CHECK_EQUAL(test_args.GetArg("-h", "xxx"), "0");
    BOOST_CHECK_EQUAL(test_args.GetArg("-i", "xxx"), "1");
    BOOST_CHECK_EQUAL(test_args.GetArg("-zzz", "xxx"), "xxx");
    BOOST_CHECK_EQUAL(test_args.GetArg("-iii", "xxx"), "xxx");

    for (const bool def : {false, true}) {
        BOOST_CHECK(test_args.GetBoolArg("-a", def));
        BOOST_CHECK(test_args.GetBoolArg("-b", def));
        BOOST_CHECK(!test_args.GetBoolArg("-ccc", def));
        BOOST_CHECK(!test_args.GetBoolArg("-d", def));
        BOOST_CHECK(!test_args.GetBoolArg("-fff", def));
        BOOST_CHECK(test_args.GetBoolArg("-ggg", def));
        BOOST_CHECK(!test_args.GetBoolArg("-h", def));
        BOOST_CHECK(test_args.GetBoolArg("-i", def));
        BOOST_CHECK(test_args.GetBoolArg("-zzz", def) == def);
        BOOST_CHECK(test_args.GetBoolArg("-iii", def) == def);
    }

    BOOST_CHECK(test_args.GetArgs("-a").size() == 1
                && test_args.GetArgs("-a").front() == "");
    BOOST_CHECK(test_args.GetArgs("-b").size() == 1
                && test_args.GetArgs("-b").front() == "1");
    BOOST_CHECK(test_args.GetArgs("-ccc").size() == 2
                && test_args.GetArgs("-ccc").front() == "argument"
                && test_args.GetArgs("-ccc").back() == "multiple");
    BOOST_CHECK(test_args.GetArgs("-fff").size() == 0);
    BOOST_CHECK(test_args.GetArgs("-nofff").size() == 0);
    BOOST_CHECK(test_args.GetArgs("-ggg").size() == 1
                && test_args.GetArgs("-ggg").front() == "1");
    BOOST_CHECK(test_args.GetArgs("-noggg").size() == 0);
    BOOST_CHECK(test_args.GetArgs("-h").size() == 0);
    BOOST_CHECK(test_args.GetArgs("-noh").size() == 0);
    BOOST_CHECK(test_args.GetArgs("-i").size() == 1
                && test_args.GetArgs("-i").front() == "1");
    BOOST_CHECK(test_args.GetArgs("-noi").size() == 0);
    BOOST_CHECK(test_args.GetArgs("-zzz").size() == 0);

    BOOST_CHECK(!test_args.IsArgNegated("-a"));
    BOOST_CHECK(!test_args.IsArgNegated("-b"));
    BOOST_CHECK(!test_args.IsArgNegated("-ccc"));
    BOOST_CHECK(!test_args.IsArgNegated("-d"));
    BOOST_CHECK(test_args.IsArgNegated("-fff"));
    BOOST_CHECK(!test_args.IsArgNegated("-ggg"));
    BOOST_CHECK(test_args.IsArgNegated("-h")); // last setting takes precedence
    BOOST_CHECK(!test_args.IsArgNegated("-i")); // last setting takes precedence
    BOOST_CHECK(!test_args.IsArgNegated("-zzz"));

    // Test sections work
    test_args.SelectConfigNetwork("sec1");

    // same as original
    BOOST_CHECK_EQUAL(test_args.GetArg("-a", "xxx"), "");
    BOOST_CHECK_EQUAL(test_args.GetArg("-b", "xxx"), "1");
    BOOST_CHECK_EQUAL(test_args.GetArg("-fff", "xxx"), "0");
    BOOST_CHECK_EQUAL(test_args.GetArg("-ggg", "xxx"), "1");
    BOOST_CHECK_EQUAL(test_args.GetArg("-zzz", "xxx"), "xxx");
    BOOST_CHECK_EQUAL(test_args.GetArg("-iii", "xxx"), "xxx");
    // d is overridden
    BOOST_CHECK(test_args.GetArg("-d", "xxx") == "eee");
    // section-specific setting
    BOOST_CHECK(test_args.GetArg("-h", "xxx") == "1");
    // section takes priority for multiple values
    BOOST_CHECK(test_args.GetArg("-ccc", "xxx") == "extend1");
    // check multiple values works
    const std::vector<std::string> sec1_ccc_expected = {"extend1","extend2","argument","multiple"};
    const auto& sec1_ccc_res = test_args.GetArgs("-ccc");
    BOOST_CHECK_EQUAL_COLLECTIONS(sec1_ccc_res.begin(), sec1_ccc_res.end(), sec1_ccc_expected.begin(), sec1_ccc_expected.end());

    test_args.SelectConfigNetwork("sec2");

    // same as original
    BOOST_CHECK(test_args.GetArg("-a", "xxx") == "");
    BOOST_CHECK(test_args.GetArg("-b", "xxx") == "1");
    BOOST_CHECK(test_args.GetArg("-d", "xxx") == "e");
    BOOST_CHECK(test_args.GetArg("-fff", "xxx") == "0");
    BOOST_CHECK(test_args.GetArg("-ggg", "xxx") == "1");
    BOOST_CHECK(test_args.GetArg("-zzz", "xxx") == "xxx");
    BOOST_CHECK(test_args.GetArg("-h", "xxx") == "0");
    // section-specific setting
    BOOST_CHECK(test_args.GetArg("-iii", "xxx") == "2");
    // section takes priority for multiple values
    BOOST_CHECK(test_args.GetArg("-ccc", "xxx") == "extend3");
    // check multiple values works
    const std::vector<std::string> sec2_ccc_expected = {"extend3","argument","multiple"};
    const auto& sec2_ccc_res = test_args.GetArgs("-ccc");
    BOOST_CHECK_EQUAL_COLLECTIONS(sec2_ccc_res.begin(), sec2_ccc_res.end(), sec2_ccc_expected.begin(), sec2_ccc_expected.end());

    // Test section only options

    test_args.SetNetworkOnlyArg("-d");
    test_args.SetNetworkOnlyArg("-ccc");
    test_args.SetNetworkOnlyArg("-h");

    test_args.SelectConfigNetwork(ChainTypeToString(ChainType::MAIN));
    BOOST_CHECK(test_args.GetArg("-d", "xxx") == "e");
    BOOST_CHECK(test_args.GetArgs("-ccc").size() == 2);
    BOOST_CHECK(test_args.GetArg("-h", "xxx") == "0");

    test_args.SelectConfigNetwork("sec1");
    BOOST_CHECK(test_args.GetArg("-d", "xxx") == "eee");
    BOOST_CHECK(test_args.GetArgs("-d").size() == 1);
    BOOST_CHECK(test_args.GetArgs("-ccc").size() == 2);
    BOOST_CHECK(test_args.GetArg("-h", "xxx") == "1");

    test_args.SelectConfigNetwork("sec2");
    BOOST_CHECK(test_args.GetArg("-d", "xxx") == "xxx");
    BOOST_CHECK(test_args.GetArgs("-d").size() == 0);
    BOOST_CHECK(test_args.GetArgs("-ccc").size() == 1);
    BOOST_CHECK(test_args.GetArg("-h", "xxx") == "0");
}